

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<4,16>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 uVar30;
  undefined8 uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  long lVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  byte bVar86;
  byte bVar87;
  ulong uVar88;
  long lVar89;
  uint uVar90;
  uint uVar91;
  ulong uVar92;
  long lVar93;
  uint uVar94;
  long lVar95;
  Geometry *pGVar96;
  uint uVar97;
  ulong uVar98;
  byte bVar99;
  float fVar100;
  float fVar150;
  float fVar152;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar101;
  undefined1 auVar109 [16];
  float fVar151;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined4 uVar156;
  vint4 bi_2;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  vint4 bi_1;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  vint4 bi;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar183;
  float fVar192;
  float fVar193;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar194;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar195;
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar196;
  float fVar203;
  float fVar204;
  vint4 ai_2;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar205;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  vint4 ai;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  vint4 ai_1;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  vint<16> mask;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  RTCFilterFunctionNArguments local_9a0;
  Geometry *local_970;
  undefined1 (*local_968) [32];
  undefined1 local_960 [32];
  undefined1 local_930 [16];
  undefined1 local_920 [8];
  undefined8 uStack_918;
  undefined1 local_910 [16];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  LinearSpace3fa *local_7c8;
  undefined4 local_7c0;
  undefined4 uStack_7bc;
  undefined4 uStack_7b8;
  undefined4 uStack_7b4;
  undefined4 uStack_7b0;
  undefined4 uStack_7ac;
  undefined4 uStack_7a8;
  undefined4 uStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined4 local_6c0;
  int local_6bc;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  byte local_670;
  float local_660 [4];
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [64];
  undefined1 local_5a0 [32];
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar6 = prim[1];
  uVar92 = (ulong)(byte)PVar6;
  fVar196 = *(float *)(prim + uVar92 * 0x19 + 0x12);
  auVar106 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar106 = vinsertps_avx(auVar106,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar104 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar104 = vinsertps_avx(auVar104,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar106 = vsubps_avx(auVar106,*(undefined1 (*) [16])(prim + uVar92 * 0x19 + 6));
  auVar184._0_4_ = fVar196 * auVar106._0_4_;
  auVar184._4_4_ = fVar196 * auVar106._4_4_;
  auVar184._8_4_ = fVar196 * auVar106._8_4_;
  auVar184._12_4_ = fVar196 * auVar106._12_4_;
  auVar157._0_4_ = fVar196 * auVar104._0_4_;
  auVar157._4_4_ = fVar196 * auVar104._4_4_;
  auVar157._8_4_ = fVar196 * auVar104._8_4_;
  auVar157._12_4_ = fVar196 * auVar104._12_4_;
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 4 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 5 + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 6 + 6)));
  auVar227 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar92 * 0xb + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar227 = vcvtdq2ps_avx(auVar227);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar6 * 0xc + uVar92 + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  uVar98 = (ulong)(uint)((int)(uVar92 * 9) * 2);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 + uVar92 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  uVar88 = (ulong)(uint)((int)(uVar92 * 5) << 2);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar88 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar221._4_4_ = auVar157._0_4_;
  auVar221._0_4_ = auVar157._0_4_;
  auVar221._8_4_ = auVar157._0_4_;
  auVar221._12_4_ = auVar157._0_4_;
  auVar108 = vshufps_avx(auVar157,auVar157,0x55);
  auVar105 = vshufps_avx(auVar157,auVar157,0xaa);
  fVar196 = auVar105._0_4_;
  auVar173._0_4_ = fVar196 * auVar107._0_4_;
  fVar203 = auVar105._4_4_;
  auVar173._4_4_ = fVar203 * auVar107._4_4_;
  fVar204 = auVar105._8_4_;
  auVar173._8_4_ = fVar204 * auVar107._8_4_;
  fVar205 = auVar105._12_4_;
  auVar173._12_4_ = fVar205 * auVar107._12_4_;
  auVar170._0_4_ = auVar26._0_4_ * fVar196;
  auVar170._4_4_ = auVar26._4_4_ * fVar203;
  auVar170._8_4_ = auVar26._8_4_ * fVar204;
  auVar170._12_4_ = auVar26._12_4_ * fVar205;
  auVar109._0_4_ = auVar29._0_4_ * fVar196;
  auVar109._4_4_ = auVar29._4_4_ * fVar203;
  auVar109._8_4_ = auVar29._8_4_ * fVar204;
  auVar109._12_4_ = auVar29._12_4_ * fVar205;
  auVar105 = vfmadd231ps_fma(auVar173,auVar108,auVar104);
  auVar103 = vfmadd231ps_fma(auVar170,auVar108,auVar25);
  auVar108 = vfmadd231ps_fma(auVar109,auVar28,auVar108);
  auVar102 = vfmadd231ps_fma(auVar105,auVar221,auVar106);
  auVar103 = vfmadd231ps_fma(auVar103,auVar221,auVar227);
  auVar157 = vfmadd231ps_fma(auVar108,auVar27,auVar221);
  auVar222._4_4_ = auVar184._0_4_;
  auVar222._0_4_ = auVar184._0_4_;
  auVar222._8_4_ = auVar184._0_4_;
  auVar222._12_4_ = auVar184._0_4_;
  auVar108 = vshufps_avx(auVar184,auVar184,0x55);
  auVar105 = vshufps_avx(auVar184,auVar184,0xaa);
  fVar196 = auVar105._0_4_;
  auVar224._0_4_ = fVar196 * auVar107._0_4_;
  fVar203 = auVar105._4_4_;
  auVar224._4_4_ = fVar203 * auVar107._4_4_;
  fVar204 = auVar105._8_4_;
  auVar224._8_4_ = fVar204 * auVar107._8_4_;
  fVar205 = auVar105._12_4_;
  auVar224._12_4_ = fVar205 * auVar107._12_4_;
  auVar197._0_4_ = auVar26._0_4_ * fVar196;
  auVar197._4_4_ = auVar26._4_4_ * fVar203;
  auVar197._8_4_ = auVar26._8_4_ * fVar204;
  auVar197._12_4_ = auVar26._12_4_ * fVar205;
  auVar185._0_4_ = auVar29._0_4_ * fVar196;
  auVar185._4_4_ = auVar29._4_4_ * fVar203;
  auVar185._8_4_ = auVar29._8_4_ * fVar204;
  auVar185._12_4_ = auVar29._12_4_ * fVar205;
  auVar104 = vfmadd231ps_fma(auVar224,auVar108,auVar104);
  auVar107 = vfmadd231ps_fma(auVar197,auVar108,auVar25);
  auVar25 = vfmadd231ps_fma(auVar185,auVar108,auVar28);
  auVar26 = vfmadd231ps_fma(auVar104,auVar222,auVar106);
  auVar28 = vfmadd231ps_fma(auVar107,auVar222,auVar227);
  auVar216._8_4_ = 0x7fffffff;
  auVar216._0_8_ = 0x7fffffff7fffffff;
  auVar216._12_4_ = 0x7fffffff;
  auVar29 = vfmadd231ps_fma(auVar25,auVar222,auVar27);
  auVar106 = vandps_avx(auVar102,auVar216);
  auVar213._8_4_ = 0x219392ef;
  auVar213._0_8_ = 0x219392ef219392ef;
  auVar213._12_4_ = 0x219392ef;
  uVar98 = vcmpps_avx512vl(auVar106,auVar213,1);
  bVar11 = (bool)((byte)uVar98 & 1);
  auVar105._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar102._0_4_;
  bVar11 = (bool)((byte)(uVar98 >> 1) & 1);
  auVar105._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar102._4_4_;
  bVar11 = (bool)((byte)(uVar98 >> 2) & 1);
  auVar105._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar102._8_4_;
  bVar11 = (bool)((byte)(uVar98 >> 3) & 1);
  auVar105._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar102._12_4_;
  auVar106 = vandps_avx(auVar103,auVar216);
  uVar98 = vcmpps_avx512vl(auVar106,auVar213,1);
  bVar11 = (bool)((byte)uVar98 & 1);
  auVar102._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar103._0_4_;
  bVar11 = (bool)((byte)(uVar98 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar103._4_4_;
  bVar11 = (bool)((byte)(uVar98 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar103._8_4_;
  bVar11 = (bool)((byte)(uVar98 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar103._12_4_;
  auVar106 = vandps_avx(auVar157,auVar216);
  uVar98 = vcmpps_avx512vl(auVar106,auVar213,1);
  bVar11 = (bool)((byte)uVar98 & 1);
  auVar103._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar157._0_4_;
  bVar11 = (bool)((byte)(uVar98 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar157._4_4_;
  bVar11 = (bool)((byte)(uVar98 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar157._8_4_;
  bVar11 = (bool)((byte)(uVar98 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar157._12_4_;
  auVar104 = vrcp14ps_avx512vl(auVar105);
  auVar214._8_4_ = 0x3f800000;
  auVar214._0_8_ = &DAT_3f8000003f800000;
  auVar214._12_4_ = 0x3f800000;
  auVar106 = vfnmadd213ps_fma(auVar105,auVar104,auVar214);
  auVar227 = vfmadd132ps_fma(auVar106,auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar102);
  auVar106 = vfnmadd213ps_fma(auVar102,auVar104,auVar214);
  auVar25 = vfmadd132ps_fma(auVar106,auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar103);
  auVar106 = vfnmadd213ps_fma(auVar103,auVar104,auVar214);
  auVar27 = vfmadd132ps_fma(auVar106,auVar104,auVar104);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar92 * 7 + 6);
  auVar106 = vpmovsxwd_avx(auVar106);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar26);
  auVar206._0_4_ = auVar227._0_4_ * auVar106._0_4_;
  auVar206._4_4_ = auVar227._4_4_ * auVar106._4_4_;
  auVar206._8_4_ = auVar227._8_4_ * auVar106._8_4_;
  auVar206._12_4_ = auVar227._12_4_ * auVar106._12_4_;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar92 * 9 + 6);
  auVar106 = vpmovsxwd_avx(auVar104);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar26);
  auVar105 = vpbroadcastd_avx512vl();
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar104 = vpmovsxwd_avx(auVar107);
  auVar174._0_4_ = auVar227._0_4_ * auVar106._0_4_;
  auVar174._4_4_ = auVar227._4_4_ * auVar106._4_4_;
  auVar174._8_4_ = auVar227._8_4_ * auVar106._8_4_;
  auVar174._12_4_ = auVar227._12_4_ * auVar106._12_4_;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar92 * -2 + 6);
  auVar106 = vpmovsxwd_avx(auVar227);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar28);
  auVar215._0_4_ = auVar25._0_4_ * auVar106._0_4_;
  auVar215._4_4_ = auVar25._4_4_ * auVar106._4_4_;
  auVar215._8_4_ = auVar25._8_4_ * auVar106._8_4_;
  auVar215._12_4_ = auVar25._12_4_ * auVar106._12_4_;
  auVar106 = vcvtdq2ps_avx(auVar104);
  auVar106 = vsubps_avx(auVar106,auVar28);
  auVar171._0_4_ = auVar25._0_4_ * auVar106._0_4_;
  auVar171._4_4_ = auVar25._4_4_ * auVar106._4_4_;
  auVar171._8_4_ = auVar25._8_4_ * auVar106._8_4_;
  auVar171._12_4_ = auVar25._12_4_ * auVar106._12_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar88 + uVar92 + 6);
  auVar106 = vpmovsxwd_avx(auVar25);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar29);
  auVar198._0_4_ = auVar27._0_4_ * auVar106._0_4_;
  auVar198._4_4_ = auVar27._4_4_ * auVar106._4_4_;
  auVar198._8_4_ = auVar27._8_4_ * auVar106._8_4_;
  auVar198._12_4_ = auVar27._12_4_ * auVar106._12_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar92 * 0x17 + 6);
  auVar106 = vpmovsxwd_avx(auVar26);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar106 = vsubps_avx(auVar106,auVar29);
  auVar158._0_4_ = auVar27._0_4_ * auVar106._0_4_;
  auVar158._4_4_ = auVar27._4_4_ * auVar106._4_4_;
  auVar158._8_4_ = auVar27._8_4_ * auVar106._8_4_;
  auVar158._12_4_ = auVar27._12_4_ * auVar106._12_4_;
  auVar106 = vpminsd_avx(auVar206,auVar174);
  auVar104 = vpminsd_avx(auVar215,auVar171);
  auVar106 = vmaxps_avx(auVar106,auVar104);
  auVar104 = vpminsd_avx(auVar198,auVar158);
  uVar156 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar27._4_4_ = uVar156;
  auVar27._0_4_ = uVar156;
  auVar27._8_4_ = uVar156;
  auVar27._12_4_ = uVar156;
  auVar104 = vmaxps_avx512vl(auVar104,auVar27);
  auVar106 = vmaxps_avx(auVar106,auVar104);
  auVar28._8_4_ = 0x3f7ffffa;
  auVar28._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar28._12_4_ = 0x3f7ffffa;
  local_530 = vmulps_avx512vl(auVar106,auVar28);
  auVar106 = vpmaxsd_avx(auVar206,auVar174);
  auVar104 = vpmaxsd_avx(auVar215,auVar171);
  auVar106 = vminps_avx(auVar106,auVar104);
  auVar104 = vpmaxsd_avx(auVar198,auVar158);
  uVar156 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar29._4_4_ = uVar156;
  auVar29._0_4_ = uVar156;
  auVar29._8_4_ = uVar156;
  auVar29._12_4_ = uVar156;
  auVar104 = vminps_avx512vl(auVar104,auVar29);
  auVar106 = vminps_avx(auVar106,auVar104);
  auVar108._8_4_ = 0x3f800003;
  auVar108._0_8_ = 0x3f8000033f800003;
  auVar108._12_4_ = 0x3f800003;
  auVar106 = vmulps_avx512vl(auVar106,auVar108);
  uVar30 = vcmpps_avx512vl(local_530,auVar106,2);
  uVar98 = vpcmpgtd_avx512vl(auVar105,_DAT_01ff0cf0);
  uVar98 = ((byte)uVar30 & 0xf) & uVar98;
  if ((char)uVar98 != '\0') {
    local_7c8 = pre->ray_space + k;
    local_968 = (undefined1 (*) [32])local_100;
    auVar169 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar169);
    do {
      lVar95 = 0;
      for (uVar88 = uVar98; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
        lVar95 = lVar95 + 1;
      }
      uVar97 = *(uint *)(prim + 2);
      uVar7 = *(uint *)(prim + lVar95 * 4 + 6);
      pGVar96 = (context->scene->geometries).items[uVar97].ptr;
      uVar88 = (ulong)*(uint *)(*(long *)&pGVar96->field_0x58 +
                               (ulong)uVar7 *
                               pGVar96[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar89 = (long)pGVar96[1].intersectionFilterN * uVar88;
      lVar95 = *(long *)&pGVar96[1].time_range.upper;
      auVar106 = *(undefined1 (*) [16])(lVar95 + lVar89);
      lVar93 = (long)pGVar96[1].intersectionFilterN * (uVar88 + 1);
      _local_920 = *(undefined1 (*) [16])(lVar95 + lVar93);
      iVar8 = (int)pGVar96[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar104 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c);
      auVar104 = vinsertps_avx(auVar104,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      lVar66 = (long)iVar8 * 0x44;
      auVar175._8_4_ = 0xbeaaaaab;
      auVar175._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar175._12_4_ = 0xbeaaaaab;
      local_910 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                    (pGVar96[2].intersectionFilterN +
                                    uVar88 * (long)pGVar96[2].pointQueryFunc),auVar106,auVar175);
      local_930 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                   (pGVar96[2].intersectionFilterN +
                                   (long)pGVar96[2].pointQueryFunc * (uVar88 + 1)),_local_920,
                                  auVar175);
      auVar227 = vsubps_avx(auVar106,auVar104);
      uVar156 = auVar227._0_4_;
      auVar176._4_4_ = uVar156;
      auVar176._0_4_ = uVar156;
      auVar176._8_4_ = uVar156;
      auVar176._12_4_ = uVar156;
      auVar107 = vshufps_avx(auVar227,auVar227,0x55);
      aVar4 = (local_7c8->vx).field_0;
      aVar5 = (local_7c8->vy).field_0;
      fVar196 = (local_7c8->vz).field_0.m128[0];
      fVar203 = *(float *)((long)&(local_7c8->vz).field_0 + 4);
      fVar204 = *(float *)((long)&(local_7c8->vz).field_0 + 8);
      fVar205 = *(float *)((long)&(local_7c8->vz).field_0 + 0xc);
      auVar227 = vshufps_avx(auVar227,auVar227,0xaa);
      auVar219._0_4_ = fVar196 * auVar227._0_4_;
      auVar219._4_4_ = fVar203 * auVar227._4_4_;
      auVar219._8_4_ = fVar204 * auVar227._8_4_;
      auVar219._12_4_ = fVar205 * auVar227._12_4_;
      auVar107 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar5,auVar107);
      auVar25 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar4,auVar176);
      auVar227 = vsubps_avx(local_910,auVar104);
      uVar156 = auVar227._0_4_;
      auVar177._4_4_ = uVar156;
      auVar177._0_4_ = uVar156;
      auVar177._8_4_ = uVar156;
      auVar177._12_4_ = uVar156;
      auVar107 = vshufps_avx(auVar227,auVar227,0x55);
      auVar227 = vshufps_avx(auVar227,auVar227,0xaa);
      auVar220._0_4_ = fVar196 * auVar227._0_4_;
      auVar220._4_4_ = fVar203 * auVar227._4_4_;
      auVar220._8_4_ = fVar204 * auVar227._8_4_;
      auVar220._12_4_ = fVar205 * auVar227._12_4_;
      auVar107 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar5,auVar107);
      auVar26 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar4,auVar177);
      auVar227 = vsubps_avx(local_930,auVar104);
      uVar156 = auVar227._0_4_;
      auVar178._4_4_ = uVar156;
      auVar178._0_4_ = uVar156;
      auVar178._8_4_ = uVar156;
      auVar178._12_4_ = uVar156;
      auVar107 = vshufps_avx(auVar227,auVar227,0x55);
      auVar227 = vshufps_avx(auVar227,auVar227,0xaa);
      auVar223._0_4_ = fVar196 * auVar227._0_4_;
      auVar223._4_4_ = fVar203 * auVar227._4_4_;
      auVar223._8_4_ = fVar204 * auVar227._8_4_;
      auVar223._12_4_ = fVar205 * auVar227._12_4_;
      auVar107 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar5,auVar107);
      auVar227 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar4,auVar178);
      auVar107 = vsubps_avx(_local_920,auVar104);
      uVar156 = auVar107._0_4_;
      auVar172._4_4_ = uVar156;
      auVar172._0_4_ = uVar156;
      auVar172._8_4_ = uVar156;
      auVar172._12_4_ = uVar156;
      auVar104 = vshufps_avx(auVar107,auVar107,0x55);
      auVar107 = vshufps_avx(auVar107,auVar107,0xaa);
      auVar225._0_4_ = fVar196 * auVar107._0_4_;
      auVar225._4_4_ = fVar203 * auVar107._4_4_;
      auVar225._8_4_ = fVar204 * auVar107._8_4_;
      auVar225._12_4_ = fVar205 * auVar107._12_4_;
      auVar104 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar5,auVar104);
      auVar27 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar4,auVar172);
      auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar66);
      uVar156 = auVar25._0_4_;
      local_760._4_4_ = uVar156;
      local_760._0_4_ = uVar156;
      local_760._8_4_ = uVar156;
      local_760._12_4_ = uVar156;
      local_760._16_4_ = uVar156;
      local_760._20_4_ = uVar156;
      local_760._24_4_ = uVar156;
      local_760._28_4_ = uVar156;
      auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar66 + 0x484);
      auVar110._8_4_ = 1;
      auVar110._0_8_ = 0x100000001;
      auVar110._12_4_ = 1;
      auVar110._16_4_ = 1;
      auVar110._20_4_ = 1;
      auVar110._24_4_ = 1;
      auVar110._28_4_ = 1;
      local_780 = vpermps_avx512vl(auVar110,ZEXT1632(auVar25));
      local_7a0 = vbroadcastss_avx512vl(auVar26);
      local_960 = vpermps_avx512vl(auVar110,ZEXT1632(auVar26));
      auVar124 = *(undefined1 (*) [32])(bezier_basis0 + lVar66 + 0x908);
      local_820 = vbroadcastss_avx512vl(auVar227);
      auVar169 = ZEXT3264(local_820);
      local_840 = vpermps_avx512vl(auVar110,ZEXT1632(auVar227));
      auVar232 = ZEXT3264(local_840);
      auVar123 = *(undefined1 (*) [32])(bezier_basis0 + lVar66 + 0xd8c);
      local_860 = vbroadcastss_avx512vl(auVar27);
      auVar233 = ZEXT3264(local_860);
      local_880 = vpermps_avx512vl(auVar110,ZEXT1632(auVar27));
      auVar234 = ZEXT3264(local_880);
      auVar110 = vmulps_avx512vl(local_860,auVar123);
      auVar111 = vmulps_avx512vl(local_880,auVar123);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar124,local_820);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar124,local_840);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar126,local_7a0);
      auVar112 = vfmadd231ps_avx512vl(auVar111,auVar126,local_960);
      auVar28 = vfmadd231ps_fma(auVar110,auVar125,local_760);
      auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar66);
      auVar111 = *(undefined1 (*) [32])(bezier_basis1 + lVar66 + 0x484);
      auVar122 = *(undefined1 (*) [32])(bezier_basis1 + lVar66 + 0x908);
      auVar113 = vfmadd231ps_avx512vl(auVar112,auVar125,local_780);
      auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar66 + 0xd8c);
      auVar114 = vmulps_avx512vl(local_860,auVar112);
      auVar115 = vmulps_avx512vl(local_880,auVar112);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar122,local_820);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar122,local_840);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar111,local_7a0);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar111,local_960);
      auVar29 = vfmadd231ps_fma(auVar114,auVar110,local_760);
      auVar114 = vfmadd231ps_avx512vl(auVar115,auVar110,local_780);
      auVar115 = vsubps_avx512vl(ZEXT1632(auVar29),ZEXT1632(auVar28));
      auVar116 = vsubps_avx512vl(auVar114,auVar113);
      auVar117 = vmulps_avx512vl(auVar113,auVar115);
      auVar118 = vmulps_avx512vl(ZEXT1632(auVar28),auVar116);
      auVar117 = vsubps_avx512vl(auVar117,auVar118);
      auVar104 = vshufps_avx(local_910,local_910,0xff);
      local_320 = vbroadcastsd_avx512vl(auVar104);
      auVar104 = vshufps_avx(local_930,local_930,0xff);
      local_340 = vbroadcastsd_avx512vl(auVar104);
      _local_360 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar95 + 0xc + lVar93)));
      auVar118 = vmulps_avx512vl(_local_360,auVar123);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar124,local_340);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar126,local_320);
      local_380 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar95 + 0xc + lVar89)));
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar125,local_380);
      auVar119 = vmulps_avx512vl(_local_360,auVar112);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar122,local_340);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar111,local_320);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar110,local_380);
      auVar120 = vmulps_avx512vl(auVar116,auVar116);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar115,auVar115);
      auVar121 = vmaxps_avx512vl(auVar118,auVar119);
      auVar121 = vmulps_avx512vl(auVar121,auVar121);
      auVar120 = vmulps_avx512vl(auVar121,auVar120);
      auVar117 = vmulps_avx512vl(auVar117,auVar117);
      uVar30 = vcmpps_avx512vl(auVar117,auVar120,2);
      auVar104 = vinsertps_avx512f(auVar25,local_380._0_16_,0x30);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar108 = vandps_avx512vl(auVar104,auVar107);
      auVar104 = vblendps_avx(auVar26,local_910,8);
      auVar104 = vandps_avx512vl(auVar104,auVar107);
      auVar108 = vmaxps_avx512vl(auVar108,auVar104);
      auVar104 = vblendps_avx(auVar227,local_930,8);
      auVar105 = vandps_avx512vl(auVar104,auVar107);
      auVar104 = vinsertps_avx512f(auVar27,local_360._0_16_,0x30);
      auVar104 = vandps_avx512vl(auVar104,auVar107);
      auVar104 = vmaxps_avx512vl(auVar105,auVar104);
      auVar104 = vmaxps_avx(auVar108,auVar104);
      auVar107 = vmovshdup_avx(auVar104);
      auVar107 = vmaxss_avx(auVar107,auVar104);
      auVar104 = vshufpd_avx(auVar104,auVar104,1);
      auVar104 = vmaxss_avx(auVar104,auVar107);
      _local_740 = vcvtsi2ss_avx512f(in_ZMM23._0_16_,iVar8);
      auVar120._0_4_ = local_740._0_4_;
      auVar120._4_4_ = auVar120._0_4_;
      auVar120._8_4_ = auVar120._0_4_;
      auVar120._12_4_ = auVar120._0_4_;
      auVar120._16_4_ = auVar120._0_4_;
      auVar120._20_4_ = auVar120._0_4_;
      auVar120._24_4_ = auVar120._0_4_;
      auVar120._28_4_ = auVar120._0_4_;
      uVar31 = vcmpps_avx512vl(auVar120,_DAT_02020f40,0xe);
      bVar99 = (byte)uVar30 & (byte)uVar31;
      auVar104 = vmulss_avx512f(auVar104,ZEXT416(0x35000000));
      auVar117._8_4_ = 2;
      auVar117._0_8_ = 0x200000002;
      auVar117._12_4_ = 2;
      auVar117._16_4_ = 2;
      auVar117._20_4_ = 2;
      auVar117._24_4_ = 2;
      auVar117._28_4_ = 2;
      local_4e0 = vpermps_avx2(auVar117,ZEXT1632(auVar25));
      local_500 = vpermps_avx2(auVar117,ZEXT1632(auVar26));
      local_3a0 = vpermps_avx512vl(auVar117,ZEXT1632(auVar227));
      local_3c0 = vpermps_avx512vl(auVar117,ZEXT1632(auVar27));
      uVar156 = *(undefined4 *)(ray + k * 4 + 0xc0);
      local_580 = auVar104._0_4_;
      uStack_57c = auVar104._4_4_;
      uStack_578 = auVar104._8_4_;
      uStack_574 = auVar104._12_4_;
      local_9b0 = auVar106._0_8_;
      uStack_9a8 = auVar106._8_8_;
      if (bVar99 == 0) {
        auVar104 = vxorps_avx512vl(auVar112._0_16_,auVar112._0_16_);
        auVar228 = ZEXT1664(auVar104);
        auVar229 = ZEXT3264(local_760);
        auVar230 = ZEXT3264(local_780);
        auVar231 = ZEXT3264(local_7a0);
        auVar236 = ZEXT3264(local_960);
      }
      else {
        uStack_7bc = 0;
        uStack_7b8 = 0;
        uStack_7b4 = 0;
        auVar112 = vmulps_avx512vl(local_3c0,auVar112);
        auVar122 = vfmadd213ps_avx512vl(auVar122,local_3a0,auVar112);
        in_ZMM23 = ZEXT3264(local_500);
        auVar111 = vfmadd213ps_avx512vl(auVar111,local_500,auVar122);
        auVar112 = vfmadd213ps_avx512vl(auVar110,local_4e0,auVar111);
        auVar123 = vmulps_avx512vl(local_3c0,auVar123);
        auVar124 = vfmadd213ps_avx512vl(auVar124,local_3a0,auVar123);
        auVar111 = vfmadd213ps_avx512vl(auVar126,local_500,auVar124);
        auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar66 + 0x1210);
        auVar124 = *(undefined1 (*) [32])(bezier_basis0 + lVar66 + 0x1694);
        auVar123 = *(undefined1 (*) [32])(bezier_basis0 + lVar66 + 0x1b18);
        auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar66 + 0x1f9c);
        auVar117 = vfmadd213ps_avx512vl(auVar125,local_4e0,auVar111);
        auVar125 = vmulps_avx512vl(local_860,auVar110);
        auVar111 = vmulps_avx512vl(local_880,auVar110);
        auVar110 = vmulps_avx512vl(local_3c0,auVar110);
        auVar125 = vfmadd231ps_avx512vl(auVar125,auVar123,local_820);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar123,local_840);
        auVar123 = vfmadd231ps_avx512vl(auVar110,local_3a0,auVar123);
        auVar107 = vfmadd231ps_fma(auVar125,auVar124,local_7a0);
        auVar236 = ZEXT3264(local_960);
        auVar125 = vfmadd231ps_avx512vl(auVar111,auVar124,local_960);
        auVar110 = vfmadd231ps_avx512vl(auVar123,local_500,auVar124);
        auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar107),auVar126,local_760);
        auVar122 = vfmadd231ps_avx512vl(auVar125,auVar126,local_780);
        auVar125 = *(undefined1 (*) [32])(bezier_basis1 + lVar66 + 0x1210);
        auVar124 = *(undefined1 (*) [32])(bezier_basis1 + lVar66 + 0x1b18);
        auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar66 + 0x1f9c);
        auVar110 = vfmadd231ps_avx512vl(auVar110,local_4e0,auVar126);
        auVar126 = vmulps_avx512vl(local_860,auVar123);
        auVar121 = vmulps_avx512vl(local_880,auVar123);
        auVar123 = vmulps_avx512vl(local_3c0,auVar123);
        auVar127 = vfmadd231ps_avx512vl(auVar126,auVar124,local_820);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar124,local_840);
        auVar124 = vfmadd231ps_avx512vl(auVar123,local_3a0,auVar124);
        auVar126 = *(undefined1 (*) [32])(bezier_basis1 + lVar66 + 0x1694);
        auVar123 = vfmadd231ps_avx512vl(auVar127,auVar126,local_7a0);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar126,local_960);
        auVar126 = vfmadd231ps_avx512vl(auVar124,local_500,auVar126);
        auVar124 = vfmadd231ps_avx512vl(auVar123,auVar125,local_760);
        auVar123 = vfmadd231ps_avx512vl(auVar121,auVar125,local_780);
        auVar126 = vfmadd231ps_avx512vl(auVar126,local_4e0,auVar125);
        auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar111,auVar121);
        vandps_avx512vl(auVar122,auVar121);
        auVar125 = vmaxps_avx(auVar121,auVar121);
        vandps_avx512vl(auVar110,auVar121);
        auVar125 = vmaxps_avx(auVar125,auVar121);
        auVar110 = vbroadcastss_avx512vl(auVar104);
        uVar88 = vcmpps_avx512vl(auVar125,auVar110,1);
        bVar11 = (bool)((byte)uVar88 & 1);
        auVar127._0_4_ = (float)((uint)bVar11 * auVar115._0_4_ | (uint)!bVar11 * auVar111._0_4_);
        bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar127._4_4_ = (float)((uint)bVar11 * auVar115._4_4_ | (uint)!bVar11 * auVar111._4_4_);
        bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar127._8_4_ = (float)((uint)bVar11 * auVar115._8_4_ | (uint)!bVar11 * auVar111._8_4_);
        bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar127._12_4_ = (float)((uint)bVar11 * auVar115._12_4_ | (uint)!bVar11 * auVar111._12_4_);
        bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar127._16_4_ = (float)((uint)bVar11 * auVar115._16_4_ | (uint)!bVar11 * auVar111._16_4_);
        bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar127._20_4_ = (float)((uint)bVar11 * auVar115._20_4_ | (uint)!bVar11 * auVar111._20_4_);
        bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar127._24_4_ = (float)((uint)bVar11 * auVar115._24_4_ | (uint)!bVar11 * auVar111._24_4_);
        bVar11 = SUB81(uVar88 >> 7,0);
        auVar127._28_4_ = (uint)bVar11 * auVar115._28_4_ | (uint)!bVar11 * auVar111._28_4_;
        bVar11 = (bool)((byte)uVar88 & 1);
        auVar135._0_4_ = (float)((uint)bVar11 * auVar116._0_4_ | (uint)!bVar11 * auVar122._0_4_);
        bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar135._4_4_ = (float)((uint)bVar11 * auVar116._4_4_ | (uint)!bVar11 * auVar122._4_4_);
        bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar135._8_4_ = (float)((uint)bVar11 * auVar116._8_4_ | (uint)!bVar11 * auVar122._8_4_);
        bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar135._12_4_ = (float)((uint)bVar11 * auVar116._12_4_ | (uint)!bVar11 * auVar122._12_4_);
        bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar135._16_4_ = (float)((uint)bVar11 * auVar116._16_4_ | (uint)!bVar11 * auVar122._16_4_);
        bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar135._20_4_ = (float)((uint)bVar11 * auVar116._20_4_ | (uint)!bVar11 * auVar122._20_4_);
        bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar135._24_4_ = (float)((uint)bVar11 * auVar116._24_4_ | (uint)!bVar11 * auVar122._24_4_);
        bVar11 = SUB81(uVar88 >> 7,0);
        auVar135._28_4_ = (uint)bVar11 * auVar116._28_4_ | (uint)!bVar11 * auVar122._28_4_;
        vandps_avx512vl(auVar124,auVar121);
        vandps_avx512vl(auVar123,auVar121);
        auVar125 = vmaxps_avx(auVar135,auVar135);
        vandps_avx512vl(auVar126,auVar121);
        auVar125 = vmaxps_avx(auVar125,auVar135);
        uVar88 = vcmpps_avx512vl(auVar125,auVar110,1);
        bVar11 = (bool)((byte)uVar88 & 1);
        auVar121._0_4_ = (float)((uint)bVar11 * auVar115._0_4_ | (uint)!bVar11 * auVar124._0_4_);
        bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar121._4_4_ = (float)((uint)bVar11 * auVar115._4_4_ | (uint)!bVar11 * auVar124._4_4_);
        bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar121._8_4_ = (float)((uint)bVar11 * auVar115._8_4_ | (uint)!bVar11 * auVar124._8_4_);
        bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar121._12_4_ = (float)((uint)bVar11 * auVar115._12_4_ | (uint)!bVar11 * auVar124._12_4_);
        bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar121._16_4_ = (float)((uint)bVar11 * auVar115._16_4_ | (uint)!bVar11 * auVar124._16_4_);
        bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar121._20_4_ = (float)((uint)bVar11 * auVar115._20_4_ | (uint)!bVar11 * auVar124._20_4_);
        bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar121._24_4_ = (float)((uint)bVar11 * auVar115._24_4_ | (uint)!bVar11 * auVar124._24_4_);
        bVar11 = SUB81(uVar88 >> 7,0);
        auVar121._28_4_ = (uint)bVar11 * auVar115._28_4_ | (uint)!bVar11 * auVar124._28_4_;
        bVar11 = (bool)((byte)uVar88 & 1);
        auVar128._0_4_ = (float)((uint)bVar11 * auVar116._0_4_ | (uint)!bVar11 * auVar123._0_4_);
        bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar11 * auVar116._4_4_ | (uint)!bVar11 * auVar123._4_4_);
        bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar11 * auVar116._8_4_ | (uint)!bVar11 * auVar123._8_4_);
        bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar11 * auVar116._12_4_ | (uint)!bVar11 * auVar123._12_4_);
        bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar128._16_4_ = (float)((uint)bVar11 * auVar116._16_4_ | (uint)!bVar11 * auVar123._16_4_);
        bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar128._20_4_ = (float)((uint)bVar11 * auVar116._20_4_ | (uint)!bVar11 * auVar123._20_4_);
        bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar128._24_4_ = (float)((uint)bVar11 * auVar116._24_4_ | (uint)!bVar11 * auVar123._24_4_);
        bVar11 = SUB81(uVar88 >> 7,0);
        auVar128._28_4_ = (uint)bVar11 * auVar116._28_4_ | (uint)!bVar11 * auVar123._28_4_;
        auVar109 = vxorps_avx512vl(local_4e0._0_16_,local_4e0._0_16_);
        auVar228 = ZEXT1664(auVar109);
        auVar125 = vfmadd213ps_avx512vl(auVar127,auVar127,ZEXT1632(auVar109));
        auVar104 = vfmadd231ps_fma(auVar125,auVar135,auVar135);
        auVar124 = vrsqrt14ps_avx512vl(ZEXT1632(auVar104));
        auVar123 = vbroadcastss_avx512vl(ZEXT416(0xbf000000));
        auVar110 = vmulps_avx512vl(ZEXT1632(auVar104),auVar123);
        fVar196 = auVar124._0_4_;
        fVar203 = auVar124._4_4_;
        fVar204 = auVar124._8_4_;
        fVar205 = auVar124._12_4_;
        fVar183 = auVar124._16_4_;
        fVar192 = auVar124._20_4_;
        fVar193 = auVar124._24_4_;
        auVar125._4_4_ = fVar203 * fVar203 * fVar203 * auVar110._4_4_;
        auVar125._0_4_ = fVar196 * fVar196 * fVar196 * auVar110._0_4_;
        auVar125._8_4_ = fVar204 * fVar204 * fVar204 * auVar110._8_4_;
        auVar125._12_4_ = fVar205 * fVar205 * fVar205 * auVar110._12_4_;
        auVar125._16_4_ = fVar183 * fVar183 * fVar183 * auVar110._16_4_;
        auVar125._20_4_ = fVar192 * fVar192 * fVar192 * auVar110._20_4_;
        auVar125._24_4_ = fVar193 * fVar193 * fVar193 * auVar110._24_4_;
        auVar125._28_4_ = auVar126._28_4_;
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar125 = vfmadd231ps_avx512vl(auVar125,auVar111,auVar124);
        auVar126._4_4_ = auVar135._4_4_ * auVar125._4_4_;
        auVar126._0_4_ = auVar135._0_4_ * auVar125._0_4_;
        auVar126._8_4_ = auVar135._8_4_ * auVar125._8_4_;
        auVar126._12_4_ = auVar135._12_4_ * auVar125._12_4_;
        auVar126._16_4_ = auVar135._16_4_ * auVar125._16_4_;
        auVar126._20_4_ = auVar135._20_4_ * auVar125._20_4_;
        auVar126._24_4_ = auVar135._24_4_ * auVar125._24_4_;
        auVar126._28_4_ = auVar110._28_4_;
        auVar124._4_4_ = auVar125._4_4_ * -auVar127._4_4_;
        auVar124._0_4_ = auVar125._0_4_ * -auVar127._0_4_;
        auVar124._8_4_ = auVar125._8_4_ * -auVar127._8_4_;
        auVar124._12_4_ = auVar125._12_4_ * -auVar127._12_4_;
        auVar124._16_4_ = auVar125._16_4_ * -auVar127._16_4_;
        auVar124._20_4_ = auVar125._20_4_ * -auVar127._20_4_;
        auVar124._24_4_ = auVar125._24_4_ * -auVar127._24_4_;
        auVar124._28_4_ = auVar135._28_4_;
        auVar110 = vmulps_avx512vl(auVar125,ZEXT1632(auVar109));
        auVar116 = ZEXT1632(auVar109);
        auVar122 = vfmadd213ps_avx512vl(auVar121,auVar121,auVar116);
        auVar104 = vfmadd231ps_fma(auVar122,auVar128,auVar128);
        auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar104));
        auVar122 = vmulps_avx512vl(ZEXT1632(auVar104),auVar123);
        fVar196 = auVar115._0_4_;
        fVar203 = auVar115._4_4_;
        fVar204 = auVar115._8_4_;
        fVar205 = auVar115._12_4_;
        fVar183 = auVar115._16_4_;
        fVar192 = auVar115._20_4_;
        fVar193 = auVar115._24_4_;
        auVar123._4_4_ = fVar203 * fVar203 * fVar203 * auVar122._4_4_;
        auVar123._0_4_ = fVar196 * fVar196 * fVar196 * auVar122._0_4_;
        auVar123._8_4_ = fVar204 * fVar204 * fVar204 * auVar122._8_4_;
        auVar123._12_4_ = fVar205 * fVar205 * fVar205 * auVar122._12_4_;
        auVar123._16_4_ = fVar183 * fVar183 * fVar183 * auVar122._16_4_;
        auVar123._20_4_ = fVar192 * fVar192 * fVar192 * auVar122._20_4_;
        auVar123._24_4_ = fVar193 * fVar193 * fVar193 * auVar122._24_4_;
        auVar123._28_4_ = auVar125._28_4_;
        auVar125 = vfmadd231ps_avx512vl(auVar123,auVar111,auVar115);
        auVar111._4_4_ = auVar128._4_4_ * auVar125._4_4_;
        auVar111._0_4_ = auVar128._0_4_ * auVar125._0_4_;
        auVar111._8_4_ = auVar128._8_4_ * auVar125._8_4_;
        auVar111._12_4_ = auVar128._12_4_ * auVar125._12_4_;
        auVar111._16_4_ = auVar128._16_4_ * auVar125._16_4_;
        auVar111._20_4_ = auVar128._20_4_ * auVar125._20_4_;
        auVar111._24_4_ = auVar128._24_4_ * auVar125._24_4_;
        auVar111._28_4_ = auVar122._28_4_;
        auVar122._4_4_ = auVar125._4_4_ * -auVar121._4_4_;
        auVar122._0_4_ = auVar125._0_4_ * -auVar121._0_4_;
        auVar122._8_4_ = auVar125._8_4_ * -auVar121._8_4_;
        auVar122._12_4_ = auVar125._12_4_ * -auVar121._12_4_;
        auVar122._16_4_ = auVar125._16_4_ * -auVar121._16_4_;
        auVar122._20_4_ = auVar125._20_4_ * -auVar121._20_4_;
        auVar122._24_4_ = auVar125._24_4_ * -auVar121._24_4_;
        auVar122._28_4_ = auVar115._28_4_;
        auVar125 = vmulps_avx512vl(auVar125,auVar116);
        auVar104 = vfmadd213ps_fma(auVar126,auVar118,ZEXT1632(auVar28));
        auVar107 = vfmadd213ps_fma(auVar124,auVar118,auVar113);
        auVar123 = vfmadd213ps_avx512vl(auVar110,auVar118,auVar117);
        auVar115 = vfmadd213ps_avx512vl(auVar111,auVar119,ZEXT1632(auVar29));
        auVar108 = vfnmadd213ps_fma(auVar126,auVar118,ZEXT1632(auVar28));
        auVar227 = vfmadd213ps_fma(auVar122,auVar119,auVar114);
        auVar105 = vfnmadd213ps_fma(auVar124,auVar118,auVar113);
        auVar25 = vfmadd213ps_fma(auVar125,auVar119,auVar112);
        auVar102 = vfnmadd231ps_fma(auVar117,auVar118,auVar110);
        auVar29 = vfnmadd213ps_fma(auVar111,auVar119,ZEXT1632(auVar29));
        auVar103 = vfnmadd213ps_fma(auVar122,auVar119,auVar114);
        auVar157 = vfnmadd231ps_fma(auVar112,auVar119,auVar125);
        auVar124 = vsubps_avx512vl(auVar115,ZEXT1632(auVar108));
        auVar125 = vsubps_avx(ZEXT1632(auVar227),ZEXT1632(auVar105));
        auVar126 = vsubps_avx(ZEXT1632(auVar25),ZEXT1632(auVar102));
        auVar112._4_4_ = auVar125._4_4_ * auVar102._4_4_;
        auVar112._0_4_ = auVar125._0_4_ * auVar102._0_4_;
        auVar112._8_4_ = auVar125._8_4_ * auVar102._8_4_;
        auVar112._12_4_ = auVar125._12_4_ * auVar102._12_4_;
        auVar112._16_4_ = auVar125._16_4_ * 0.0;
        auVar112._20_4_ = auVar125._20_4_ * 0.0;
        auVar112._24_4_ = auVar125._24_4_ * 0.0;
        auVar112._28_4_ = auVar110._28_4_;
        auVar26 = vfmsub231ps_fma(auVar112,ZEXT1632(auVar105),auVar126);
        auVar113._4_4_ = auVar126._4_4_ * auVar108._4_4_;
        auVar113._0_4_ = auVar126._0_4_ * auVar108._0_4_;
        auVar113._8_4_ = auVar126._8_4_ * auVar108._8_4_;
        auVar113._12_4_ = auVar126._12_4_ * auVar108._12_4_;
        auVar113._16_4_ = auVar126._16_4_ * 0.0;
        auVar113._20_4_ = auVar126._20_4_ * 0.0;
        auVar113._24_4_ = auVar126._24_4_ * 0.0;
        auVar113._28_4_ = auVar126._28_4_;
        auVar27 = vfmsub231ps_fma(auVar113,ZEXT1632(auVar102),auVar124);
        auVar114._4_4_ = auVar105._4_4_ * auVar124._4_4_;
        auVar114._0_4_ = auVar105._0_4_ * auVar124._0_4_;
        auVar114._8_4_ = auVar105._8_4_ * auVar124._8_4_;
        auVar114._12_4_ = auVar105._12_4_ * auVar124._12_4_;
        auVar114._16_4_ = auVar124._16_4_ * 0.0;
        auVar114._20_4_ = auVar124._20_4_ * 0.0;
        auVar114._24_4_ = auVar124._24_4_ * 0.0;
        auVar114._28_4_ = auVar124._28_4_;
        auVar28 = vfmsub231ps_fma(auVar114,ZEXT1632(auVar108),auVar125);
        auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar28),auVar116,ZEXT1632(auVar27));
        auVar125 = vfmadd231ps_avx512vl(auVar125,auVar116,ZEXT1632(auVar26));
        auVar117 = ZEXT1632(auVar109);
        uVar88 = vcmpps_avx512vl(auVar125,auVar117,2);
        bVar87 = (byte)uVar88;
        fVar100 = (float)((uint)(bVar87 & 1) * auVar104._0_4_ |
                         (uint)!(bool)(bVar87 & 1) * auVar29._0_4_);
        bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
        fVar150 = (float)((uint)bVar11 * auVar104._4_4_ | (uint)!bVar11 * auVar29._4_4_);
        bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
        fVar152 = (float)((uint)bVar11 * auVar104._8_4_ | (uint)!bVar11 * auVar29._8_4_);
        bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
        fVar154 = (float)((uint)bVar11 * auVar104._12_4_ | (uint)!bVar11 * auVar29._12_4_);
        auVar122 = ZEXT1632(CONCAT412(fVar154,CONCAT48(fVar152,CONCAT44(fVar150,fVar100))));
        fVar101 = (float)((uint)(bVar87 & 1) * auVar107._0_4_ |
                         (uint)!(bool)(bVar87 & 1) * auVar103._0_4_);
        bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
        fVar151 = (float)((uint)bVar11 * auVar107._4_4_ | (uint)!bVar11 * auVar103._4_4_);
        bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
        fVar153 = (float)((uint)bVar11 * auVar107._8_4_ | (uint)!bVar11 * auVar103._8_4_);
        bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
        fVar155 = (float)((uint)bVar11 * auVar107._12_4_ | (uint)!bVar11 * auVar103._12_4_);
        auVar112 = ZEXT1632(CONCAT412(fVar155,CONCAT48(fVar153,CONCAT44(fVar151,fVar101))));
        auVar129._0_4_ =
             (float)((uint)(bVar87 & 1) * auVar123._0_4_ |
                    (uint)!(bool)(bVar87 & 1) * auVar157._0_4_);
        bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar129._4_4_ = (float)((uint)bVar11 * auVar123._4_4_ | (uint)!bVar11 * auVar157._4_4_);
        bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar129._8_4_ = (float)((uint)bVar11 * auVar123._8_4_ | (uint)!bVar11 * auVar157._8_4_);
        bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar129._12_4_ = (float)((uint)bVar11 * auVar123._12_4_ | (uint)!bVar11 * auVar157._12_4_);
        fVar203 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar123._16_4_);
        auVar129._16_4_ = fVar203;
        fVar196 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar123._20_4_);
        auVar129._20_4_ = fVar196;
        fVar204 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar123._24_4_);
        auVar129._24_4_ = fVar204;
        iVar1 = (uint)(byte)(uVar88 >> 7) * auVar123._28_4_;
        auVar129._28_4_ = iVar1;
        auVar125 = vblendmps_avx512vl(ZEXT1632(auVar108),auVar115);
        auVar130._0_4_ =
             (uint)(bVar87 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar87 & 1) * auVar104._0_4_;
        bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar11 * auVar125._4_4_ | (uint)!bVar11 * auVar104._4_4_;
        bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar11 * auVar125._8_4_ | (uint)!bVar11 * auVar104._8_4_;
        bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar11 * auVar125._12_4_ | (uint)!bVar11 * auVar104._12_4_;
        auVar130._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * auVar125._16_4_;
        auVar130._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * auVar125._20_4_;
        auVar130._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * auVar125._24_4_;
        auVar130._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar125._28_4_;
        auVar125 = vblendmps_avx512vl(ZEXT1632(auVar105),ZEXT1632(auVar227));
        auVar131._0_4_ =
             (float)((uint)(bVar87 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar87 & 1) * auVar26._0_4_
                    );
        bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar131._4_4_ = (float)((uint)bVar11 * auVar125._4_4_ | (uint)!bVar11 * auVar26._4_4_);
        bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar131._8_4_ = (float)((uint)bVar11 * auVar125._8_4_ | (uint)!bVar11 * auVar26._8_4_);
        bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar131._12_4_ = (float)((uint)bVar11 * auVar125._12_4_ | (uint)!bVar11 * auVar26._12_4_);
        fVar205 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar125._16_4_);
        auVar131._16_4_ = fVar205;
        fVar183 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar125._20_4_);
        auVar131._20_4_ = fVar183;
        fVar192 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar125._24_4_);
        auVar131._24_4_ = fVar192;
        auVar131._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar125._28_4_;
        auVar125 = vblendmps_avx512vl(ZEXT1632(auVar102),ZEXT1632(auVar25));
        auVar132._0_4_ =
             (float)((uint)(bVar87 & 1) * auVar125._0_4_ |
                    (uint)!(bool)(bVar87 & 1) * auVar107._0_4_);
        bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar132._4_4_ = (float)((uint)bVar11 * auVar125._4_4_ | (uint)!bVar11 * auVar107._4_4_);
        bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar132._8_4_ = (float)((uint)bVar11 * auVar125._8_4_ | (uint)!bVar11 * auVar107._8_4_);
        bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar132._12_4_ = (float)((uint)bVar11 * auVar125._12_4_ | (uint)!bVar11 * auVar107._12_4_);
        fVar195 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar125._16_4_);
        auVar132._16_4_ = fVar195;
        fVar194 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar125._20_4_);
        auVar132._20_4_ = fVar194;
        fVar193 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar125._24_4_);
        auVar132._24_4_ = fVar193;
        iVar2 = (uint)(byte)(uVar88 >> 7) * auVar125._28_4_;
        auVar132._28_4_ = iVar2;
        auVar133._0_4_ =
             (uint)(bVar87 & 1) * (int)auVar108._0_4_ | (uint)!(bool)(bVar87 & 1) * auVar115._0_4_;
        bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar11 * (int)auVar108._4_4_ | (uint)!bVar11 * auVar115._4_4_;
        bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar11 * (int)auVar108._8_4_ | (uint)!bVar11 * auVar115._8_4_;
        bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar11 * (int)auVar108._12_4_ | (uint)!bVar11 * auVar115._12_4_;
        auVar133._16_4_ = (uint)!(bool)((byte)(uVar88 >> 4) & 1) * auVar115._16_4_;
        auVar133._20_4_ = (uint)!(bool)((byte)(uVar88 >> 5) & 1) * auVar115._20_4_;
        auVar133._24_4_ = (uint)!(bool)((byte)(uVar88 >> 6) & 1) * auVar115._24_4_;
        auVar133._28_4_ = (uint)!SUB81(uVar88 >> 7,0) * auVar115._28_4_;
        bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar88 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar113 = vsubps_avx512vl(auVar133,auVar122);
        auVar126 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar105._12_4_ |
                                                 (uint)!bVar15 * auVar227._12_4_,
                                                 CONCAT48((uint)bVar13 * (int)auVar105._8_4_ |
                                                          (uint)!bVar13 * auVar227._8_4_,
                                                          CONCAT44((uint)bVar11 *
                                                                   (int)auVar105._4_4_ |
                                                                   (uint)!bVar11 * auVar227._4_4_,
                                                                   (uint)(bVar87 & 1) *
                                                                   (int)auVar105._0_4_ |
                                                                   (uint)!(bool)(bVar87 & 1) *
                                                                   auVar227._0_4_)))),auVar112);
        auVar124 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar102._12_4_ |
                                                 (uint)!bVar16 * auVar25._12_4_,
                                                 CONCAT48((uint)bVar14 * (int)auVar102._8_4_ |
                                                          (uint)!bVar14 * auVar25._8_4_,
                                                          CONCAT44((uint)bVar12 *
                                                                   (int)auVar102._4_4_ |
                                                                   (uint)!bVar12 * auVar25._4_4_,
                                                                   (uint)(bVar87 & 1) *
                                                                   (int)auVar102._0_4_ |
                                                                   (uint)!(bool)(bVar87 & 1) *
                                                                   auVar25._0_4_)))),auVar129);
        auVar123 = vsubps_avx(auVar122,auVar130);
        auVar110 = vsubps_avx(auVar112,auVar131);
        auVar111 = vsubps_avx(auVar129,auVar132);
        auVar115._4_4_ = auVar124._4_4_ * fVar150;
        auVar115._0_4_ = auVar124._0_4_ * fVar100;
        auVar115._8_4_ = auVar124._8_4_ * fVar152;
        auVar115._12_4_ = auVar124._12_4_ * fVar154;
        auVar115._16_4_ = auVar124._16_4_ * 0.0;
        auVar115._20_4_ = auVar124._20_4_ * 0.0;
        auVar115._24_4_ = auVar124._24_4_ * 0.0;
        auVar115._28_4_ = 0;
        auVar104 = vfmsub231ps_fma(auVar115,auVar129,auVar113);
        auVar190._0_4_ = fVar101 * auVar113._0_4_;
        auVar190._4_4_ = fVar151 * auVar113._4_4_;
        auVar190._8_4_ = fVar153 * auVar113._8_4_;
        auVar190._12_4_ = fVar155 * auVar113._12_4_;
        auVar190._16_4_ = auVar113._16_4_ * 0.0;
        auVar190._20_4_ = auVar113._20_4_ * 0.0;
        auVar190._24_4_ = auVar113._24_4_ * 0.0;
        auVar190._28_4_ = 0;
        auVar107 = vfmsub231ps_fma(auVar190,auVar122,auVar126);
        auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar107),auVar117,ZEXT1632(auVar104));
        auVar199._0_4_ = auVar126._0_4_ * auVar129._0_4_;
        auVar199._4_4_ = auVar126._4_4_ * auVar129._4_4_;
        auVar199._8_4_ = auVar126._8_4_ * auVar129._8_4_;
        auVar199._12_4_ = auVar126._12_4_ * auVar129._12_4_;
        auVar199._16_4_ = auVar126._16_4_ * fVar203;
        auVar199._20_4_ = auVar126._20_4_ * fVar196;
        auVar199._24_4_ = auVar126._24_4_ * fVar204;
        auVar199._28_4_ = 0;
        auVar104 = vfmsub231ps_fma(auVar199,auVar112,auVar124);
        auVar114 = vfmadd231ps_avx512vl(auVar125,auVar117,ZEXT1632(auVar104));
        auVar125 = vmulps_avx512vl(auVar111,auVar130);
        auVar125 = vfmsub231ps_avx512vl(auVar125,auVar123,auVar132);
        auVar116._4_4_ = auVar110._4_4_ * auVar132._4_4_;
        auVar116._0_4_ = auVar110._0_4_ * auVar132._0_4_;
        auVar116._8_4_ = auVar110._8_4_ * auVar132._8_4_;
        auVar116._12_4_ = auVar110._12_4_ * auVar132._12_4_;
        auVar116._16_4_ = auVar110._16_4_ * fVar195;
        auVar116._20_4_ = auVar110._20_4_ * fVar194;
        auVar116._24_4_ = auVar110._24_4_ * fVar193;
        auVar116._28_4_ = iVar2;
        auVar104 = vfmsub231ps_fma(auVar116,auVar131,auVar111);
        auVar200._0_4_ = auVar131._0_4_ * auVar123._0_4_;
        auVar200._4_4_ = auVar131._4_4_ * auVar123._4_4_;
        auVar200._8_4_ = auVar131._8_4_ * auVar123._8_4_;
        auVar200._12_4_ = auVar131._12_4_ * auVar123._12_4_;
        auVar200._16_4_ = fVar205 * auVar123._16_4_;
        auVar200._20_4_ = fVar183 * auVar123._20_4_;
        auVar200._24_4_ = fVar192 * auVar123._24_4_;
        auVar200._28_4_ = 0;
        auVar107 = vfmsub231ps_fma(auVar200,auVar110,auVar130);
        auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar107),auVar117,auVar125);
        auVar115 = vfmadd231ps_avx512vl(auVar125,auVar117,ZEXT1632(auVar104));
        auVar125 = vmaxps_avx(auVar114,auVar115);
        uVar30 = vcmpps_avx512vl(auVar125,auVar117,2);
        bVar99 = bVar99 & (byte)uVar30;
        auVar229 = ZEXT3264(local_760);
        auVar230 = ZEXT3264(local_780);
        auVar231 = ZEXT3264(local_7a0);
        if (bVar99 == 0) {
          bVar99 = 0;
        }
        else {
          auVar41._4_4_ = auVar111._4_4_ * auVar126._4_4_;
          auVar41._0_4_ = auVar111._0_4_ * auVar126._0_4_;
          auVar41._8_4_ = auVar111._8_4_ * auVar126._8_4_;
          auVar41._12_4_ = auVar111._12_4_ * auVar126._12_4_;
          auVar41._16_4_ = auVar111._16_4_ * auVar126._16_4_;
          auVar41._20_4_ = auVar111._20_4_ * auVar126._20_4_;
          auVar41._24_4_ = auVar111._24_4_ * auVar126._24_4_;
          auVar41._28_4_ = auVar125._28_4_;
          auVar227 = vfmsub231ps_fma(auVar41,auVar110,auVar124);
          auVar42._4_4_ = auVar124._4_4_ * auVar123._4_4_;
          auVar42._0_4_ = auVar124._0_4_ * auVar123._0_4_;
          auVar42._8_4_ = auVar124._8_4_ * auVar123._8_4_;
          auVar42._12_4_ = auVar124._12_4_ * auVar123._12_4_;
          auVar42._16_4_ = auVar124._16_4_ * auVar123._16_4_;
          auVar42._20_4_ = auVar124._20_4_ * auVar123._20_4_;
          auVar42._24_4_ = auVar124._24_4_ * auVar123._24_4_;
          auVar42._28_4_ = auVar124._28_4_;
          auVar107 = vfmsub231ps_fma(auVar42,auVar113,auVar111);
          auVar43._4_4_ = auVar110._4_4_ * auVar113._4_4_;
          auVar43._0_4_ = auVar110._0_4_ * auVar113._0_4_;
          auVar43._8_4_ = auVar110._8_4_ * auVar113._8_4_;
          auVar43._12_4_ = auVar110._12_4_ * auVar113._12_4_;
          auVar43._16_4_ = auVar110._16_4_ * auVar113._16_4_;
          auVar43._20_4_ = auVar110._20_4_ * auVar113._20_4_;
          auVar43._24_4_ = auVar110._24_4_ * auVar113._24_4_;
          auVar43._28_4_ = auVar110._28_4_;
          auVar25 = vfmsub231ps_fma(auVar43,auVar123,auVar126);
          auVar104 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar107),ZEXT1632(auVar25));
          auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),ZEXT1632(auVar227),auVar117);
          auVar126 = vrcp14ps_avx512vl(auVar125);
          auVar33._8_4_ = 0x3f800000;
          auVar33._0_8_ = &DAT_3f8000003f800000;
          auVar33._12_4_ = 0x3f800000;
          auVar33._16_4_ = 0x3f800000;
          auVar33._20_4_ = 0x3f800000;
          auVar33._24_4_ = 0x3f800000;
          auVar33._28_4_ = 0x3f800000;
          auVar124 = vfnmadd213ps_avx512vl(auVar126,auVar125,auVar33);
          auVar104 = vfmadd132ps_fma(auVar124,auVar126,auVar126);
          auVar44._4_4_ = auVar25._4_4_ * auVar129._4_4_;
          auVar44._0_4_ = auVar25._0_4_ * auVar129._0_4_;
          auVar44._8_4_ = auVar25._8_4_ * auVar129._8_4_;
          auVar44._12_4_ = auVar25._12_4_ * auVar129._12_4_;
          auVar44._16_4_ = fVar203 * 0.0;
          auVar44._20_4_ = fVar196 * 0.0;
          auVar44._24_4_ = fVar204 * 0.0;
          auVar44._28_4_ = iVar1;
          auVar107 = vfmadd231ps_fma(auVar44,auVar112,ZEXT1632(auVar107));
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar122,ZEXT1632(auVar227));
          fVar196 = auVar104._0_4_;
          fVar203 = auVar104._4_4_;
          fVar204 = auVar104._8_4_;
          fVar205 = auVar104._12_4_;
          auVar126 = ZEXT1632(CONCAT412(auVar107._12_4_ * fVar205,
                                        CONCAT48(auVar107._8_4_ * fVar204,
                                                 CONCAT44(auVar107._4_4_ * fVar203,
                                                          auVar107._0_4_ * fVar196))));
          auVar217._4_4_ = uVar156;
          auVar217._0_4_ = uVar156;
          auVar217._8_4_ = uVar156;
          auVar217._12_4_ = uVar156;
          auVar217._16_4_ = uVar156;
          auVar217._20_4_ = uVar156;
          auVar217._24_4_ = uVar156;
          auVar217._28_4_ = uVar156;
          uVar30 = vcmpps_avx512vl(auVar217,auVar126,2);
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar34._4_4_ = uVar3;
          auVar34._0_4_ = uVar3;
          auVar34._8_4_ = uVar3;
          auVar34._12_4_ = uVar3;
          auVar34._16_4_ = uVar3;
          auVar34._20_4_ = uVar3;
          auVar34._24_4_ = uVar3;
          auVar34._28_4_ = uVar3;
          uVar31 = vcmpps_avx512vl(auVar126,auVar34,2);
          bVar99 = (byte)uVar30 & (byte)uVar31 & bVar99;
          if (bVar99 != 0) {
            uVar30 = vcmpps_avx512vl(auVar125,auVar117,4);
            if ((bVar99 & (byte)uVar30) != 0) {
              bVar99 = bVar99 & (byte)uVar30;
              fVar183 = auVar114._0_4_ * fVar196;
              fVar192 = auVar114._4_4_ * fVar203;
              auVar45._4_4_ = fVar192;
              auVar45._0_4_ = fVar183;
              fVar193 = auVar114._8_4_ * fVar204;
              auVar45._8_4_ = fVar193;
              fVar194 = auVar114._12_4_ * fVar205;
              auVar45._12_4_ = fVar194;
              fVar195 = auVar114._16_4_ * 0.0;
              auVar45._16_4_ = fVar195;
              fVar100 = auVar114._20_4_ * 0.0;
              auVar45._20_4_ = fVar100;
              fVar101 = auVar114._24_4_ * 0.0;
              auVar45._24_4_ = fVar101;
              auVar45._28_4_ = auVar114._28_4_;
              fVar196 = auVar115._0_4_ * fVar196;
              fVar203 = auVar115._4_4_ * fVar203;
              auVar46._4_4_ = fVar203;
              auVar46._0_4_ = fVar196;
              fVar204 = auVar115._8_4_ * fVar204;
              auVar46._8_4_ = fVar204;
              fVar205 = auVar115._12_4_ * fVar205;
              auVar46._12_4_ = fVar205;
              fVar150 = auVar115._16_4_ * 0.0;
              auVar46._16_4_ = fVar150;
              fVar151 = auVar115._20_4_ * 0.0;
              auVar46._20_4_ = fVar151;
              fVar152 = auVar115._24_4_ * 0.0;
              auVar46._24_4_ = fVar152;
              auVar46._28_4_ = auVar115._28_4_;
              auVar211._8_4_ = 0x3f800000;
              auVar211._0_8_ = &DAT_3f8000003f800000;
              auVar211._12_4_ = 0x3f800000;
              auVar211._16_4_ = 0x3f800000;
              auVar211._20_4_ = 0x3f800000;
              auVar211._24_4_ = 0x3f800000;
              auVar211._28_4_ = 0x3f800000;
              auVar125 = vsubps_avx(auVar211,auVar45);
              local_8a0._0_4_ =
                   (uint)(bVar87 & 1) * (int)fVar183 | (uint)!(bool)(bVar87 & 1) * auVar125._0_4_;
              bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
              local_8a0._4_4_ = (uint)bVar11 * (int)fVar192 | (uint)!bVar11 * auVar125._4_4_;
              bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
              local_8a0._8_4_ = (uint)bVar11 * (int)fVar193 | (uint)!bVar11 * auVar125._8_4_;
              bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
              local_8a0._12_4_ = (uint)bVar11 * (int)fVar194 | (uint)!bVar11 * auVar125._12_4_;
              bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
              local_8a0._16_4_ = (uint)bVar11 * (int)fVar195 | (uint)!bVar11 * auVar125._16_4_;
              bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
              local_8a0._20_4_ = (uint)bVar11 * (int)fVar100 | (uint)!bVar11 * auVar125._20_4_;
              bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
              local_8a0._24_4_ = (uint)bVar11 * (int)fVar101 | (uint)!bVar11 * auVar125._24_4_;
              bVar11 = SUB81(uVar88 >> 7,0);
              local_8a0._28_4_ = (uint)bVar11 * auVar114._28_4_ | (uint)!bVar11 * auVar125._28_4_;
              auVar125 = vsubps_avx(auVar211,auVar46);
              local_560._0_4_ =
                   (uint)(bVar87 & 1) * (int)fVar196 | (uint)!(bool)(bVar87 & 1) * auVar125._0_4_;
              bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
              local_560._4_4_ = (uint)bVar11 * (int)fVar203 | (uint)!bVar11 * auVar125._4_4_;
              bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
              local_560._8_4_ = (uint)bVar11 * (int)fVar204 | (uint)!bVar11 * auVar125._8_4_;
              bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
              local_560._12_4_ = (uint)bVar11 * (int)fVar205 | (uint)!bVar11 * auVar125._12_4_;
              bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
              local_560._16_4_ = (uint)bVar11 * (int)fVar150 | (uint)!bVar11 * auVar125._16_4_;
              bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
              local_560._20_4_ = (uint)bVar11 * (int)fVar151 | (uint)!bVar11 * auVar125._20_4_;
              bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
              local_560._24_4_ = (uint)bVar11 * (int)fVar152 | (uint)!bVar11 * auVar125._24_4_;
              bVar11 = SUB81(uVar88 >> 7,0);
              local_560._28_4_ = (uint)bVar11 * auVar115._28_4_ | (uint)!bVar11 * auVar125._28_4_;
              local_8c0 = auVar126;
              goto LAB_01b3360b;
            }
          }
          bVar99 = 0;
        }
LAB_01b3360b:
        auVar234 = ZEXT3264(local_880);
        auVar233 = ZEXT3264(local_860);
        auVar232 = ZEXT3264(local_840);
        auVar169 = ZEXT3264(local_820);
        if (bVar99 != 0) {
          auVar125 = vsubps_avx(auVar119,auVar118);
          auVar104 = vfmadd213ps_fma(auVar125,local_8a0,auVar118);
          uVar3 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
          auVar118._4_4_ = uVar3;
          auVar118._0_4_ = uVar3;
          auVar118._8_4_ = uVar3;
          auVar118._12_4_ = uVar3;
          auVar118._16_4_ = uVar3;
          auVar118._20_4_ = uVar3;
          auVar118._24_4_ = uVar3;
          auVar118._28_4_ = uVar3;
          auVar125 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar104._12_4_ + auVar104._12_4_,
                                                        CONCAT48(auVar104._8_4_ + auVar104._8_4_,
                                                                 CONCAT44(auVar104._4_4_ +
                                                                          auVar104._4_4_,
                                                                          auVar104._0_4_ +
                                                                          auVar104._0_4_)))),
                                     auVar118);
          uVar30 = vcmpps_avx512vl(local_8c0,auVar125,6);
          bVar99 = bVar99 & (byte)uVar30;
          if (bVar99 != 0) {
            auVar163._8_4_ = 0xbf800000;
            auVar163._0_8_ = 0xbf800000bf800000;
            auVar163._12_4_ = 0xbf800000;
            auVar163._16_4_ = 0xbf800000;
            auVar163._20_4_ = 0xbf800000;
            auVar163._24_4_ = 0xbf800000;
            auVar163._28_4_ = 0xbf800000;
            auVar119._8_4_ = 0x40000000;
            auVar119._0_8_ = 0x4000000040000000;
            auVar119._12_4_ = 0x40000000;
            auVar119._16_4_ = 0x40000000;
            auVar119._20_4_ = 0x40000000;
            auVar119._24_4_ = 0x40000000;
            auVar119._28_4_ = 0x40000000;
            local_700 = vfmadd132ps_avx512vl(local_560,auVar163,auVar119);
            local_560 = local_700;
            auVar125 = local_560;
            local_6c0 = 0;
            local_6b0 = local_9b0;
            uStack_6a8 = uStack_9a8;
            local_6a0 = local_910._0_8_;
            uStack_698 = local_910._8_8_;
            local_690 = local_930._0_8_;
            uStack_688 = local_930._8_8_;
            local_680 = local_920;
            uStack_678 = uStack_918;
            local_560 = auVar125;
            if ((pGVar96->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
              fVar196 = 1.0 / auVar120._0_4_;
              local_660[0] = fVar196 * (local_8a0._0_4_ + 0.0);
              local_660[1] = fVar196 * (local_8a0._4_4_ + 1.0);
              local_660[2] = fVar196 * (local_8a0._8_4_ + 2.0);
              local_660[3] = fVar196 * (local_8a0._12_4_ + 3.0);
              fStack_650 = fVar196 * (local_8a0._16_4_ + 4.0);
              fStack_64c = fVar196 * (local_8a0._20_4_ + 5.0);
              fStack_648 = fVar196 * (local_8a0._24_4_ + 6.0);
              fStack_644 = local_8a0._28_4_ + 7.0;
              local_560._0_8_ = local_700._0_8_;
              local_560._8_8_ = local_700._8_8_;
              local_560._16_8_ = local_700._16_8_;
              local_560._24_8_ = local_700._24_8_;
              local_640 = local_560._0_8_;
              uStack_638 = local_560._8_8_;
              uStack_630 = local_560._16_8_;
              uStack_628 = local_560._24_8_;
              local_620 = local_8c0;
              auVar164._8_4_ = 0x7f800000;
              auVar164._0_8_ = 0x7f8000007f800000;
              auVar164._12_4_ = 0x7f800000;
              auVar164._16_4_ = 0x7f800000;
              auVar164._20_4_ = 0x7f800000;
              auVar164._24_4_ = 0x7f800000;
              auVar164._28_4_ = 0x7f800000;
              auVar125 = vblendmps_avx512vl(auVar164,local_8c0);
              auVar134._0_4_ =
                   (uint)(bVar99 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar99 & 1) * 0x7f800000;
              bVar11 = (bool)(bVar99 >> 1 & 1);
              auVar134._4_4_ = (uint)bVar11 * auVar125._4_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar99 >> 2 & 1);
              auVar134._8_4_ = (uint)bVar11 * auVar125._8_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar99 >> 3 & 1);
              auVar134._12_4_ = (uint)bVar11 * auVar125._12_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar99 >> 4 & 1);
              auVar134._16_4_ = (uint)bVar11 * auVar125._16_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar99 >> 5 & 1);
              auVar134._20_4_ = (uint)bVar11 * auVar125._20_4_ | (uint)!bVar11 * 0x7f800000;
              bVar11 = (bool)(bVar99 >> 6 & 1);
              auVar134._24_4_ = (uint)bVar11 * auVar125._24_4_ | (uint)!bVar11 * 0x7f800000;
              auVar134._28_4_ =
                   (uint)(bVar99 >> 7) * auVar125._28_4_ | (uint)!(bool)(bVar99 >> 7) * 0x7f800000;
              auVar125 = vshufps_avx(auVar134,auVar134,0xb1);
              auVar125 = vminps_avx(auVar134,auVar125);
              auVar126 = vshufpd_avx(auVar125,auVar125,5);
              auVar125 = vminps_avx(auVar125,auVar126);
              auVar126 = vpermpd_avx2(auVar125,0x4e);
              auVar125 = vminps_avx(auVar125,auVar126);
              uVar30 = vcmpps_avx512vl(auVar134,auVar125,0);
              bVar86 = (byte)uVar30 & bVar99;
              bVar87 = bVar99;
              if (bVar86 != 0) {
                bVar87 = bVar86;
              }
              uVar94 = 0;
              for (uVar90 = (uint)bVar87; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                uVar94 = uVar94 + 1;
              }
              uVar88 = (ulong)uVar94;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar96->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar196 = local_660[uVar88];
                uVar3 = *(undefined4 *)((long)&local_640 + uVar88 * 4);
                fVar204 = 1.0 - fVar196;
                fVar203 = fVar204 * fVar204 * -3.0;
                auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar204 * fVar204)),
                                           ZEXT416((uint)(fVar196 * fVar204)),ZEXT416(0xc0000000));
                auVar107 = vfmsub132ss_fma(ZEXT416((uint)(fVar196 * fVar204)),
                                           ZEXT416((uint)(fVar196 * fVar196)),ZEXT416(0x40000000));
                fVar204 = auVar104._0_4_ * 3.0;
                fVar205 = auVar107._0_4_ * 3.0;
                fVar183 = fVar196 * fVar196 * 3.0;
                auVar207._0_4_ = fVar183 * (float)local_920._0_4_;
                auVar207._4_4_ = fVar183 * (float)local_920._4_4_;
                auVar207._8_4_ = fVar183 * (float)uStack_918;
                auVar207._12_4_ = fVar183 * uStack_918._4_4_;
                auVar179._4_4_ = fVar205;
                auVar179._0_4_ = fVar205;
                auVar179._8_4_ = fVar205;
                auVar179._12_4_ = fVar205;
                auVar104 = vfmadd132ps_fma(auVar179,auVar207,local_930);
                auVar186._4_4_ = fVar204;
                auVar186._0_4_ = fVar204;
                auVar186._8_4_ = fVar204;
                auVar186._12_4_ = fVar204;
                auVar104 = vfmadd132ps_fma(auVar186,auVar104,local_910);
                auVar180._4_4_ = fVar203;
                auVar180._0_4_ = fVar203;
                auVar180._8_4_ = fVar203;
                auVar180._12_4_ = fVar203;
                auVar104 = vfmadd132ps_fma(auVar180,auVar104,auVar106);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar88 * 4);
                *(int *)(ray + k * 4 + 0x300) = auVar104._0_4_;
                uVar9 = vextractps_avx(auVar104,1);
                *(undefined4 *)(ray + k * 4 + 0x340) = uVar9;
                uVar9 = vextractps_avx(auVar104,2);
                *(undefined4 *)(ray + k * 4 + 0x380) = uVar9;
                *(float *)(ray + k * 4 + 0x3c0) = fVar196;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar3;
                *(uint *)(ray + k * 4 + 0x440) = uVar7;
                *(uint *)(ray + k * 4 + 0x480) = uVar97;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
              }
              else {
                auVar148 = vpbroadcastd_avx512f();
                local_4c0 = vmovdqa64_avx512f(auVar148);
                auVar148 = vpbroadcastd_avx512f();
                local_440 = vmovdqa64_avx512f(auVar148);
                local_7e0 = local_910._0_8_;
                uStack_7d8 = local_910._8_8_;
                local_7f0 = local_930._0_8_;
                uStack_7e8 = local_930._8_8_;
                local_800 = local_920;
                uStack_7f8 = uStack_918;
                local_7c0 = uVar156;
                local_720 = local_8a0;
                local_6e0 = local_8c0;
                local_6bc = iVar8;
                local_670 = bVar99;
                do {
                  auVar227 = auVar228._0_16_;
                  local_400._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_660[uVar88]));
                  local_1c0 = vbroadcastss_avx512f
                                        (ZEXT416(*(uint *)((long)&local_640 + uVar88 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar88 * 4);
                  local_9a0.context = context->user;
                  fVar205 = local_200._0_4_;
                  fVar203 = 1.0 - fVar205;
                  fVar196 = fVar203 * fVar203 * -3.0;
                  auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * fVar203)),
                                             ZEXT416((uint)(fVar205 * fVar203)),ZEXT416(0xc0000000))
                  ;
                  auVar107 = vfmsub132ss_fma(ZEXT416((uint)(fVar205 * fVar203)),
                                             ZEXT416((uint)(fVar205 * fVar205)),ZEXT416(0x40000000))
                  ;
                  fVar203 = auVar104._0_4_ * 3.0;
                  fVar204 = auVar107._0_4_ * 3.0;
                  fVar205 = fVar205 * fVar205 * 3.0;
                  auVar210._0_4_ = fVar205 * (float)local_800;
                  auVar210._4_4_ = fVar205 * local_800._4_4_;
                  auVar210._8_4_ = fVar205 * (float)uStack_7f8;
                  auVar210._12_4_ = fVar205 * uStack_7f8._4_4_;
                  auVar161._4_4_ = fVar204;
                  auVar161._0_4_ = fVar204;
                  auVar161._8_4_ = fVar204;
                  auVar161._12_4_ = fVar204;
                  auVar81._8_8_ = uStack_7e8;
                  auVar81._0_8_ = local_7f0;
                  auVar104 = vfmadd132ps_fma(auVar161,auVar210,auVar81);
                  auVar189._4_4_ = fVar203;
                  auVar189._0_4_ = fVar203;
                  auVar189._8_4_ = fVar203;
                  auVar189._12_4_ = fVar203;
                  auVar83._8_8_ = uStack_7d8;
                  auVar83._0_8_ = local_7e0;
                  auVar104 = vfmadd132ps_fma(auVar189,auVar104,auVar83);
                  auVar162._4_4_ = fVar196;
                  auVar162._0_4_ = fVar196;
                  auVar162._8_4_ = fVar196;
                  auVar162._12_4_ = fVar196;
                  auVar104 = vfmadd132ps_fma(auVar162,auVar104,auVar106);
                  auVar148 = vbroadcastss_avx512f(auVar104);
                  auVar235 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar235,ZEXT1664(auVar104));
                  auVar235 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar235,ZEXT1664(auVar104));
                  local_2c0[0] = (RTCHitN)auVar148[0];
                  local_2c0[1] = (RTCHitN)auVar148[1];
                  local_2c0[2] = (RTCHitN)auVar148[2];
                  local_2c0[3] = (RTCHitN)auVar148[3];
                  local_2c0[4] = (RTCHitN)auVar148[4];
                  local_2c0[5] = (RTCHitN)auVar148[5];
                  local_2c0[6] = (RTCHitN)auVar148[6];
                  local_2c0[7] = (RTCHitN)auVar148[7];
                  local_2c0[8] = (RTCHitN)auVar148[8];
                  local_2c0[9] = (RTCHitN)auVar148[9];
                  local_2c0[10] = (RTCHitN)auVar148[10];
                  local_2c0[0xb] = (RTCHitN)auVar148[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar148[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar148[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar148[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar148[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar148[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar148[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar148[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar148[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar148[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar148[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar148[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar148[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar148[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar148[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar148[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar148[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar148[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar148[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar148[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar148[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar148[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar148[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar148[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar148[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar148[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar148[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar148[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar148[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar148[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar148[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar148[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar148[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar148[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar148[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar148[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar148[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar148[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar148[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar148[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar148[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar148[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar148[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar148[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar148[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar148[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar148[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar148[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar148[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar148[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar148[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar148[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar148[0x3f];
                  local_180 = local_440._0_8_;
                  uStack_178 = local_440._8_8_;
                  uStack_170 = local_440._16_8_;
                  uStack_168 = local_440._24_8_;
                  uStack_160 = local_440._32_8_;
                  uStack_158 = local_440._40_8_;
                  uStack_150 = local_440._48_8_;
                  uStack_148 = local_440._56_8_;
                  auVar148 = vmovdqa64_avx512f(local_4c0);
                  local_140 = vmovdqa64_avx512f(auVar148);
                  auVar125 = vpcmpeqd_avx2(auVar148._0_32_,auVar148._0_32_);
                  local_968[3] = auVar125;
                  local_968[2] = auVar125;
                  local_968[1] = auVar125;
                  *local_968 = auVar125;
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_9a0.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_9a0.context)->instPrimID[0]));
                  local_600 = local_300;
                  local_9a0.valid = (int *)local_600;
                  local_9a0.geometryUserPtr = pGVar96->userPtr;
                  local_9a0.hit = local_2c0;
                  local_9a0.N = 0x10;
                  local_480._0_8_ = uVar88;
                  local_9a0.ray = (RTCRayN *)ray;
                  if (pGVar96->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar96->intersectionFilterN)(&local_9a0);
                    auVar234 = ZEXT3264(local_880);
                    auVar233 = ZEXT3264(local_860);
                    auVar232 = ZEXT3264(local_840);
                    auVar169 = ZEXT3264(local_820);
                    auVar236 = ZEXT3264(local_960);
                    auVar231 = ZEXT3264(local_7a0);
                    auVar230 = ZEXT3264(local_780);
                    auVar229 = ZEXT3264(local_760);
                    auVar104 = vxorps_avx512vl(auVar227,auVar227);
                    auVar228 = ZEXT1664(auVar104);
                    uVar88 = local_480._0_8_;
                    uVar156 = local_7c0;
                  }
                  auVar104 = auVar228._0_16_;
                  auVar148 = vmovdqa64_avx512f(local_600);
                  uVar30 = vptestmd_avx512f(auVar148,auVar148);
                  if ((short)uVar30 == 0) {
LAB_01b34c41:
                    *(undefined4 *)(ray + k * 4 + 0x200) = local_400._0_4_;
                  }
                  else {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar96->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&local_9a0);
                      auVar234 = ZEXT3264(local_880);
                      auVar233 = ZEXT3264(local_860);
                      auVar232 = ZEXT3264(local_840);
                      auVar169 = ZEXT3264(local_820);
                      auVar236 = ZEXT3264(local_960);
                      auVar231 = ZEXT3264(local_7a0);
                      auVar230 = ZEXT3264(local_780);
                      auVar229 = ZEXT3264(local_760);
                      auVar104 = vxorps_avx512vl(auVar104,auVar104);
                      auVar228 = ZEXT1664(auVar104);
                      uVar88 = local_480._0_8_;
                      uVar156 = local_7c0;
                    }
                    auVar148 = vmovdqa64_avx512f(local_600);
                    uVar92 = vptestmd_avx512f(auVar148,auVar148);
                    if ((short)uVar92 == 0) goto LAB_01b34c41;
                    iVar1 = *(int *)(local_9a0.hit + 4);
                    iVar2 = *(int *)(local_9a0.hit + 8);
                    iVar67 = *(int *)(local_9a0.hit + 0xc);
                    iVar68 = *(int *)(local_9a0.hit + 0x10);
                    iVar69 = *(int *)(local_9a0.hit + 0x14);
                    iVar70 = *(int *)(local_9a0.hit + 0x18);
                    iVar71 = *(int *)(local_9a0.hit + 0x1c);
                    iVar72 = *(int *)(local_9a0.hit + 0x20);
                    iVar73 = *(int *)(local_9a0.hit + 0x24);
                    iVar74 = *(int *)(local_9a0.hit + 0x28);
                    iVar75 = *(int *)(local_9a0.hit + 0x2c);
                    iVar76 = *(int *)(local_9a0.hit + 0x30);
                    iVar77 = *(int *)(local_9a0.hit + 0x34);
                    iVar78 = *(int *)(local_9a0.hit + 0x38);
                    iVar79 = *(int *)(local_9a0.hit + 0x3c);
                    bVar87 = (byte)uVar92;
                    bVar11 = (bool)((byte)(uVar92 >> 1) & 1);
                    bVar12 = (bool)((byte)(uVar92 >> 2) & 1);
                    bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
                    bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
                    bVar15 = (bool)((byte)(uVar92 >> 5) & 1);
                    bVar16 = (bool)((byte)(uVar92 >> 6) & 1);
                    bVar17 = (bool)((byte)(uVar92 >> 7) & 1);
                    bVar86 = (byte)(uVar92 >> 8);
                    bVar18 = (bool)((byte)(uVar92 >> 9) & 1);
                    bVar19 = (bool)((byte)(uVar92 >> 10) & 1);
                    bVar20 = (bool)((byte)(uVar92 >> 0xb) & 1);
                    bVar21 = (bool)((byte)(uVar92 >> 0xc) & 1);
                    bVar22 = (bool)((byte)(uVar92 >> 0xd) & 1);
                    bVar23 = (bool)((byte)(uVar92 >> 0xe) & 1);
                    bVar24 = SUB81(uVar92 >> 0xf,0);
                    *(uint *)(local_9a0.ray + 0x300) =
                         (uint)(bVar87 & 1) * *(int *)local_9a0.hit |
                         (uint)!(bool)(bVar87 & 1) * *(int *)(local_9a0.ray + 0x300);
                    *(uint *)(local_9a0.ray + 0x304) =
                         (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_9a0.ray + 0x304);
                    *(uint *)(local_9a0.ray + 0x308) =
                         (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_9a0.ray + 0x308);
                    *(uint *)(local_9a0.ray + 0x30c) =
                         (uint)bVar13 * iVar67 | (uint)!bVar13 * *(int *)(local_9a0.ray + 0x30c);
                    *(uint *)(local_9a0.ray + 0x310) =
                         (uint)bVar14 * iVar68 | (uint)!bVar14 * *(int *)(local_9a0.ray + 0x310);
                    *(uint *)(local_9a0.ray + 0x314) =
                         (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_9a0.ray + 0x314);
                    *(uint *)(local_9a0.ray + 0x318) =
                         (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_9a0.ray + 0x318);
                    *(uint *)(local_9a0.ray + 0x31c) =
                         (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_9a0.ray + 0x31c);
                    *(uint *)(local_9a0.ray + 800) =
                         (uint)(bVar86 & 1) * iVar72 |
                         (uint)!(bool)(bVar86 & 1) * *(int *)(local_9a0.ray + 800);
                    *(uint *)(local_9a0.ray + 0x324) =
                         (uint)bVar18 * iVar73 | (uint)!bVar18 * *(int *)(local_9a0.ray + 0x324);
                    *(uint *)(local_9a0.ray + 0x328) =
                         (uint)bVar19 * iVar74 | (uint)!bVar19 * *(int *)(local_9a0.ray + 0x328);
                    *(uint *)(local_9a0.ray + 0x32c) =
                         (uint)bVar20 * iVar75 | (uint)!bVar20 * *(int *)(local_9a0.ray + 0x32c);
                    *(uint *)(local_9a0.ray + 0x330) =
                         (uint)bVar21 * iVar76 | (uint)!bVar21 * *(int *)(local_9a0.ray + 0x330);
                    *(uint *)(local_9a0.ray + 0x334) =
                         (uint)bVar22 * iVar77 | (uint)!bVar22 * *(int *)(local_9a0.ray + 0x334);
                    *(uint *)(local_9a0.ray + 0x338) =
                         (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_9a0.ray + 0x338);
                    *(uint *)(local_9a0.ray + 0x33c) =
                         (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_9a0.ray + 0x33c);
                    iVar1 = *(int *)(local_9a0.hit + 0x44);
                    iVar2 = *(int *)(local_9a0.hit + 0x48);
                    iVar67 = *(int *)(local_9a0.hit + 0x4c);
                    iVar68 = *(int *)(local_9a0.hit + 0x50);
                    iVar69 = *(int *)(local_9a0.hit + 0x54);
                    iVar70 = *(int *)(local_9a0.hit + 0x58);
                    iVar71 = *(int *)(local_9a0.hit + 0x5c);
                    iVar72 = *(int *)(local_9a0.hit + 0x60);
                    iVar73 = *(int *)(local_9a0.hit + 100);
                    iVar74 = *(int *)(local_9a0.hit + 0x68);
                    iVar75 = *(int *)(local_9a0.hit + 0x6c);
                    iVar76 = *(int *)(local_9a0.hit + 0x70);
                    iVar77 = *(int *)(local_9a0.hit + 0x74);
                    iVar78 = *(int *)(local_9a0.hit + 0x78);
                    iVar79 = *(int *)(local_9a0.hit + 0x7c);
                    bVar11 = (bool)((byte)(uVar92 >> 1) & 1);
                    bVar12 = (bool)((byte)(uVar92 >> 2) & 1);
                    bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
                    bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
                    bVar15 = (bool)((byte)(uVar92 >> 5) & 1);
                    bVar16 = (bool)((byte)(uVar92 >> 6) & 1);
                    bVar17 = (bool)((byte)(uVar92 >> 7) & 1);
                    bVar18 = (bool)((byte)(uVar92 >> 9) & 1);
                    bVar19 = (bool)((byte)(uVar92 >> 10) & 1);
                    bVar20 = (bool)((byte)(uVar92 >> 0xb) & 1);
                    bVar21 = (bool)((byte)(uVar92 >> 0xc) & 1);
                    bVar22 = (bool)((byte)(uVar92 >> 0xd) & 1);
                    bVar23 = (bool)((byte)(uVar92 >> 0xe) & 1);
                    bVar24 = SUB81(uVar92 >> 0xf,0);
                    *(uint *)(local_9a0.ray + 0x340) =
                         (uint)(bVar87 & 1) * *(int *)(local_9a0.hit + 0x40) |
                         (uint)!(bool)(bVar87 & 1) * *(int *)(local_9a0.ray + 0x340);
                    *(uint *)(local_9a0.ray + 0x344) =
                         (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_9a0.ray + 0x344);
                    *(uint *)(local_9a0.ray + 0x348) =
                         (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_9a0.ray + 0x348);
                    *(uint *)(local_9a0.ray + 0x34c) =
                         (uint)bVar13 * iVar67 | (uint)!bVar13 * *(int *)(local_9a0.ray + 0x34c);
                    *(uint *)(local_9a0.ray + 0x350) =
                         (uint)bVar14 * iVar68 | (uint)!bVar14 * *(int *)(local_9a0.ray + 0x350);
                    *(uint *)(local_9a0.ray + 0x354) =
                         (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_9a0.ray + 0x354);
                    *(uint *)(local_9a0.ray + 0x358) =
                         (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_9a0.ray + 0x358);
                    *(uint *)(local_9a0.ray + 0x35c) =
                         (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_9a0.ray + 0x35c);
                    *(uint *)(local_9a0.ray + 0x360) =
                         (uint)(bVar86 & 1) * iVar72 |
                         (uint)!(bool)(bVar86 & 1) * *(int *)(local_9a0.ray + 0x360);
                    *(uint *)(local_9a0.ray + 0x364) =
                         (uint)bVar18 * iVar73 | (uint)!bVar18 * *(int *)(local_9a0.ray + 0x364);
                    *(uint *)(local_9a0.ray + 0x368) =
                         (uint)bVar19 * iVar74 | (uint)!bVar19 * *(int *)(local_9a0.ray + 0x368);
                    *(uint *)(local_9a0.ray + 0x36c) =
                         (uint)bVar20 * iVar75 | (uint)!bVar20 * *(int *)(local_9a0.ray + 0x36c);
                    *(uint *)(local_9a0.ray + 0x370) =
                         (uint)bVar21 * iVar76 | (uint)!bVar21 * *(int *)(local_9a0.ray + 0x370);
                    *(uint *)(local_9a0.ray + 0x374) =
                         (uint)bVar22 * iVar77 | (uint)!bVar22 * *(int *)(local_9a0.ray + 0x374);
                    *(uint *)(local_9a0.ray + 0x378) =
                         (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_9a0.ray + 0x378);
                    *(uint *)(local_9a0.ray + 0x37c) =
                         (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_9a0.ray + 0x37c);
                    iVar1 = *(int *)(local_9a0.hit + 0x84);
                    iVar2 = *(int *)(local_9a0.hit + 0x88);
                    iVar67 = *(int *)(local_9a0.hit + 0x8c);
                    iVar68 = *(int *)(local_9a0.hit + 0x90);
                    iVar69 = *(int *)(local_9a0.hit + 0x94);
                    iVar70 = *(int *)(local_9a0.hit + 0x98);
                    iVar71 = *(int *)(local_9a0.hit + 0x9c);
                    iVar72 = *(int *)(local_9a0.hit + 0xa0);
                    iVar73 = *(int *)(local_9a0.hit + 0xa4);
                    iVar74 = *(int *)(local_9a0.hit + 0xa8);
                    iVar75 = *(int *)(local_9a0.hit + 0xac);
                    iVar76 = *(int *)(local_9a0.hit + 0xb0);
                    iVar77 = *(int *)(local_9a0.hit + 0xb4);
                    iVar78 = *(int *)(local_9a0.hit + 0xb8);
                    iVar79 = *(int *)(local_9a0.hit + 0xbc);
                    bVar11 = (bool)((byte)(uVar92 >> 1) & 1);
                    bVar12 = (bool)((byte)(uVar92 >> 2) & 1);
                    bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
                    bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
                    bVar15 = (bool)((byte)(uVar92 >> 5) & 1);
                    bVar16 = (bool)((byte)(uVar92 >> 6) & 1);
                    bVar17 = (bool)((byte)(uVar92 >> 7) & 1);
                    bVar18 = (bool)((byte)(uVar92 >> 9) & 1);
                    bVar19 = (bool)((byte)(uVar92 >> 10) & 1);
                    bVar20 = (bool)((byte)(uVar92 >> 0xb) & 1);
                    bVar21 = (bool)((byte)(uVar92 >> 0xc) & 1);
                    bVar22 = (bool)((byte)(uVar92 >> 0xd) & 1);
                    bVar23 = (bool)((byte)(uVar92 >> 0xe) & 1);
                    bVar24 = SUB81(uVar92 >> 0xf,0);
                    *(uint *)(local_9a0.ray + 0x380) =
                         (uint)(bVar87 & 1) * *(int *)(local_9a0.hit + 0x80) |
                         (uint)!(bool)(bVar87 & 1) * *(int *)(local_9a0.ray + 0x380);
                    *(uint *)(local_9a0.ray + 900) =
                         (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_9a0.ray + 900);
                    *(uint *)(local_9a0.ray + 0x388) =
                         (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_9a0.ray + 0x388);
                    *(uint *)(local_9a0.ray + 0x38c) =
                         (uint)bVar13 * iVar67 | (uint)!bVar13 * *(int *)(local_9a0.ray + 0x38c);
                    *(uint *)(local_9a0.ray + 0x390) =
                         (uint)bVar14 * iVar68 | (uint)!bVar14 * *(int *)(local_9a0.ray + 0x390);
                    *(uint *)(local_9a0.ray + 0x394) =
                         (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_9a0.ray + 0x394);
                    *(uint *)(local_9a0.ray + 0x398) =
                         (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_9a0.ray + 0x398);
                    *(uint *)(local_9a0.ray + 0x39c) =
                         (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_9a0.ray + 0x39c);
                    *(uint *)(local_9a0.ray + 0x3a0) =
                         (uint)(bVar86 & 1) * iVar72 |
                         (uint)!(bool)(bVar86 & 1) * *(int *)(local_9a0.ray + 0x3a0);
                    *(uint *)(local_9a0.ray + 0x3a4) =
                         (uint)bVar18 * iVar73 | (uint)!bVar18 * *(int *)(local_9a0.ray + 0x3a4);
                    *(uint *)(local_9a0.ray + 0x3a8) =
                         (uint)bVar19 * iVar74 | (uint)!bVar19 * *(int *)(local_9a0.ray + 0x3a8);
                    *(uint *)(local_9a0.ray + 0x3ac) =
                         (uint)bVar20 * iVar75 | (uint)!bVar20 * *(int *)(local_9a0.ray + 0x3ac);
                    *(uint *)(local_9a0.ray + 0x3b0) =
                         (uint)bVar21 * iVar76 | (uint)!bVar21 * *(int *)(local_9a0.ray + 0x3b0);
                    *(uint *)(local_9a0.ray + 0x3b4) =
                         (uint)bVar22 * iVar77 | (uint)!bVar22 * *(int *)(local_9a0.ray + 0x3b4);
                    *(uint *)(local_9a0.ray + 0x3b8) =
                         (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_9a0.ray + 0x3b8);
                    *(uint *)(local_9a0.ray + 0x3bc) =
                         (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_9a0.ray + 0x3bc);
                    iVar1 = *(int *)(local_9a0.hit + 0xc4);
                    iVar2 = *(int *)(local_9a0.hit + 200);
                    iVar67 = *(int *)(local_9a0.hit + 0xcc);
                    iVar68 = *(int *)(local_9a0.hit + 0xd0);
                    iVar69 = *(int *)(local_9a0.hit + 0xd4);
                    iVar70 = *(int *)(local_9a0.hit + 0xd8);
                    iVar71 = *(int *)(local_9a0.hit + 0xdc);
                    iVar72 = *(int *)(local_9a0.hit + 0xe0);
                    iVar73 = *(int *)(local_9a0.hit + 0xe4);
                    iVar74 = *(int *)(local_9a0.hit + 0xe8);
                    iVar75 = *(int *)(local_9a0.hit + 0xec);
                    iVar76 = *(int *)(local_9a0.hit + 0xf0);
                    iVar77 = *(int *)(local_9a0.hit + 0xf4);
                    iVar78 = *(int *)(local_9a0.hit + 0xf8);
                    iVar79 = *(int *)(local_9a0.hit + 0xfc);
                    bVar11 = (bool)((byte)(uVar92 >> 1) & 1);
                    bVar12 = (bool)((byte)(uVar92 >> 2) & 1);
                    bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
                    bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
                    bVar15 = (bool)((byte)(uVar92 >> 5) & 1);
                    bVar16 = (bool)((byte)(uVar92 >> 6) & 1);
                    bVar17 = (bool)((byte)(uVar92 >> 7) & 1);
                    bVar18 = (bool)((byte)(uVar92 >> 9) & 1);
                    bVar19 = (bool)((byte)(uVar92 >> 10) & 1);
                    bVar20 = (bool)((byte)(uVar92 >> 0xb) & 1);
                    bVar21 = (bool)((byte)(uVar92 >> 0xc) & 1);
                    bVar22 = (bool)((byte)(uVar92 >> 0xd) & 1);
                    bVar23 = (bool)((byte)(uVar92 >> 0xe) & 1);
                    bVar24 = SUB81(uVar92 >> 0xf,0);
                    *(uint *)(local_9a0.ray + 0x3c0) =
                         (uint)(bVar87 & 1) * *(int *)(local_9a0.hit + 0xc0) |
                         (uint)!(bool)(bVar87 & 1) * *(int *)(local_9a0.ray + 0x3c0);
                    *(uint *)(local_9a0.ray + 0x3c4) =
                         (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_9a0.ray + 0x3c4);
                    *(uint *)(local_9a0.ray + 0x3c8) =
                         (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_9a0.ray + 0x3c8);
                    *(uint *)(local_9a0.ray + 0x3cc) =
                         (uint)bVar13 * iVar67 | (uint)!bVar13 * *(int *)(local_9a0.ray + 0x3cc);
                    *(uint *)(local_9a0.ray + 0x3d0) =
                         (uint)bVar14 * iVar68 | (uint)!bVar14 * *(int *)(local_9a0.ray + 0x3d0);
                    *(uint *)(local_9a0.ray + 0x3d4) =
                         (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_9a0.ray + 0x3d4);
                    *(uint *)(local_9a0.ray + 0x3d8) =
                         (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_9a0.ray + 0x3d8);
                    *(uint *)(local_9a0.ray + 0x3dc) =
                         (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_9a0.ray + 0x3dc);
                    *(uint *)(local_9a0.ray + 0x3e0) =
                         (uint)(bVar86 & 1) * iVar72 |
                         (uint)!(bool)(bVar86 & 1) * *(int *)(local_9a0.ray + 0x3e0);
                    *(uint *)(local_9a0.ray + 0x3e4) =
                         (uint)bVar18 * iVar73 | (uint)!bVar18 * *(int *)(local_9a0.ray + 0x3e4);
                    *(uint *)(local_9a0.ray + 1000) =
                         (uint)bVar19 * iVar74 | (uint)!bVar19 * *(int *)(local_9a0.ray + 1000);
                    *(uint *)(local_9a0.ray + 0x3ec) =
                         (uint)bVar20 * iVar75 | (uint)!bVar20 * *(int *)(local_9a0.ray + 0x3ec);
                    *(uint *)(local_9a0.ray + 0x3f0) =
                         (uint)bVar21 * iVar76 | (uint)!bVar21 * *(int *)(local_9a0.ray + 0x3f0);
                    *(uint *)(local_9a0.ray + 0x3f4) =
                         (uint)bVar22 * iVar77 | (uint)!bVar22 * *(int *)(local_9a0.ray + 0x3f4);
                    *(uint *)(local_9a0.ray + 0x3f8) =
                         (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_9a0.ray + 0x3f8);
                    *(uint *)(local_9a0.ray + 0x3fc) =
                         (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_9a0.ray + 0x3fc);
                    iVar1 = *(int *)(local_9a0.hit + 0x104);
                    iVar2 = *(int *)(local_9a0.hit + 0x108);
                    iVar67 = *(int *)(local_9a0.hit + 0x10c);
                    iVar68 = *(int *)(local_9a0.hit + 0x110);
                    iVar69 = *(int *)(local_9a0.hit + 0x114);
                    iVar70 = *(int *)(local_9a0.hit + 0x118);
                    iVar71 = *(int *)(local_9a0.hit + 0x11c);
                    iVar72 = *(int *)(local_9a0.hit + 0x120);
                    iVar73 = *(int *)(local_9a0.hit + 0x124);
                    iVar74 = *(int *)(local_9a0.hit + 0x128);
                    iVar75 = *(int *)(local_9a0.hit + 300);
                    iVar76 = *(int *)(local_9a0.hit + 0x130);
                    iVar77 = *(int *)(local_9a0.hit + 0x134);
                    iVar78 = *(int *)(local_9a0.hit + 0x138);
                    iVar79 = *(int *)(local_9a0.hit + 0x13c);
                    bVar11 = (bool)((byte)(uVar92 >> 1) & 1);
                    bVar12 = (bool)((byte)(uVar92 >> 2) & 1);
                    bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
                    bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
                    bVar15 = (bool)((byte)(uVar92 >> 5) & 1);
                    bVar16 = (bool)((byte)(uVar92 >> 6) & 1);
                    bVar17 = (bool)((byte)(uVar92 >> 7) & 1);
                    bVar18 = (bool)((byte)(uVar92 >> 9) & 1);
                    bVar19 = (bool)((byte)(uVar92 >> 10) & 1);
                    bVar20 = (bool)((byte)(uVar92 >> 0xb) & 1);
                    bVar21 = (bool)((byte)(uVar92 >> 0xc) & 1);
                    bVar22 = (bool)((byte)(uVar92 >> 0xd) & 1);
                    bVar23 = (bool)((byte)(uVar92 >> 0xe) & 1);
                    bVar24 = SUB81(uVar92 >> 0xf,0);
                    *(uint *)(local_9a0.ray + 0x400) =
                         (uint)(bVar87 & 1) * *(int *)(local_9a0.hit + 0x100) |
                         (uint)!(bool)(bVar87 & 1) * *(int *)(local_9a0.ray + 0x400);
                    *(uint *)(local_9a0.ray + 0x404) =
                         (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_9a0.ray + 0x404);
                    *(uint *)(local_9a0.ray + 0x408) =
                         (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_9a0.ray + 0x408);
                    *(uint *)(local_9a0.ray + 0x40c) =
                         (uint)bVar13 * iVar67 | (uint)!bVar13 * *(int *)(local_9a0.ray + 0x40c);
                    *(uint *)(local_9a0.ray + 0x410) =
                         (uint)bVar14 * iVar68 | (uint)!bVar14 * *(int *)(local_9a0.ray + 0x410);
                    *(uint *)(local_9a0.ray + 0x414) =
                         (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_9a0.ray + 0x414);
                    *(uint *)(local_9a0.ray + 0x418) =
                         (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_9a0.ray + 0x418);
                    *(uint *)(local_9a0.ray + 0x41c) =
                         (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_9a0.ray + 0x41c);
                    *(uint *)(local_9a0.ray + 0x420) =
                         (uint)(bVar86 & 1) * iVar72 |
                         (uint)!(bool)(bVar86 & 1) * *(int *)(local_9a0.ray + 0x420);
                    *(uint *)(local_9a0.ray + 0x424) =
                         (uint)bVar18 * iVar73 | (uint)!bVar18 * *(int *)(local_9a0.ray + 0x424);
                    *(uint *)(local_9a0.ray + 0x428) =
                         (uint)bVar19 * iVar74 | (uint)!bVar19 * *(int *)(local_9a0.ray + 0x428);
                    *(uint *)(local_9a0.ray + 0x42c) =
                         (uint)bVar20 * iVar75 | (uint)!bVar20 * *(int *)(local_9a0.ray + 0x42c);
                    *(uint *)(local_9a0.ray + 0x430) =
                         (uint)bVar21 * iVar76 | (uint)!bVar21 * *(int *)(local_9a0.ray + 0x430);
                    *(uint *)(local_9a0.ray + 0x434) =
                         (uint)bVar22 * iVar77 | (uint)!bVar22 * *(int *)(local_9a0.ray + 0x434);
                    *(uint *)(local_9a0.ray + 0x438) =
                         (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_9a0.ray + 0x438);
                    *(uint *)(local_9a0.ray + 0x43c) =
                         (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_9a0.ray + 0x43c);
                    auVar148 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_9a0.hit + 0x140));
                    auVar148 = vmovdqu32_avx512f(auVar148);
                    *(undefined1 (*) [64])(local_9a0.ray + 0x440) = auVar148;
                    auVar148 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_9a0.hit + 0x180));
                    auVar148 = vmovdqu32_avx512f(auVar148);
                    *(undefined1 (*) [64])(local_9a0.ray + 0x480) = auVar148;
                    auVar148 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_9a0.hit + 0x1c0));
                    auVar148 = vmovdqa32_avx512f(auVar148);
                    *(undefined1 (*) [64])(local_9a0.ray + 0x4c0) = auVar148;
                    auVar148 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_9a0.hit + 0x200));
                    auVar148 = vmovdqa32_avx512f(auVar148);
                    *(undefined1 (*) [64])(local_9a0.ray + 0x500) = auVar148;
                  }
                  bVar87 = ~(byte)(1 << ((uint)uVar88 & 0x1f)) & bVar99;
                  uVar3 = *(undefined4 *)(ray + k * 4 + 0x200);
                  auVar40._4_4_ = uVar3;
                  auVar40._0_4_ = uVar3;
                  auVar40._8_4_ = uVar3;
                  auVar40._12_4_ = uVar3;
                  auVar40._16_4_ = uVar3;
                  auVar40._20_4_ = uVar3;
                  auVar40._24_4_ = uVar3;
                  auVar40._28_4_ = uVar3;
                  uVar30 = vcmpps_avx512vl(local_8c0,auVar40,2);
                  bVar99 = bVar87 & (byte)uVar30;
                  if ((bVar87 & (byte)uVar30) != 0) {
                    auVar168._8_4_ = 0x7f800000;
                    auVar168._0_8_ = 0x7f8000007f800000;
                    auVar168._12_4_ = 0x7f800000;
                    auVar168._16_4_ = 0x7f800000;
                    auVar168._20_4_ = 0x7f800000;
                    auVar168._24_4_ = 0x7f800000;
                    auVar168._28_4_ = 0x7f800000;
                    auVar125 = vblendmps_avx512vl(auVar168,local_8c0);
                    auVar147._0_4_ =
                         (uint)(bVar99 & 1) * auVar125._0_4_ |
                         (uint)!(bool)(bVar99 & 1) * 0x7f800000;
                    bVar11 = (bool)(bVar99 >> 1 & 1);
                    auVar147._4_4_ = (uint)bVar11 * auVar125._4_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar99 >> 2 & 1);
                    auVar147._8_4_ = (uint)bVar11 * auVar125._8_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar99 >> 3 & 1);
                    auVar147._12_4_ = (uint)bVar11 * auVar125._12_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar99 >> 4 & 1);
                    auVar147._16_4_ = (uint)bVar11 * auVar125._16_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar99 >> 5 & 1);
                    auVar147._20_4_ = (uint)bVar11 * auVar125._20_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar99 >> 6 & 1);
                    auVar147._24_4_ = (uint)bVar11 * auVar125._24_4_ | (uint)!bVar11 * 0x7f800000;
                    auVar147._28_4_ =
                         (uint)(bVar99 >> 7) * auVar125._28_4_ |
                         (uint)!(bool)(bVar99 >> 7) * 0x7f800000;
                    auVar125 = vshufps_avx(auVar147,auVar147,0xb1);
                    auVar125 = vminps_avx(auVar147,auVar125);
                    auVar126 = vshufpd_avx(auVar125,auVar125,5);
                    auVar125 = vminps_avx(auVar125,auVar126);
                    auVar126 = vpermpd_avx2(auVar125,0x4e);
                    auVar125 = vminps_avx(auVar125,auVar126);
                    uVar30 = vcmpps_avx512vl(auVar147,auVar125,0);
                    bVar86 = (byte)uVar30 & bVar99;
                    bVar87 = bVar99;
                    if (bVar86 != 0) {
                      bVar87 = bVar86;
                    }
                    uVar94 = 0;
                    for (uVar90 = (uint)bVar87; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000
                        ) {
                      uVar94 = uVar94 + 1;
                    }
                    uVar88 = (ulong)uVar94;
                  }
                } while (bVar99 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar8) {
        auVar125 = vpbroadcastd_avx512vl();
        auVar235 = ZEXT3264(auVar125);
        local_7c0 = local_580;
        uStack_7bc = local_580;
        uStack_7b8 = local_580;
        uStack_7b4 = local_580;
        uStack_7b0 = local_580;
        uStack_7ac = local_580;
        uStack_7a8 = local_580;
        uStack_7a4 = local_580;
        local_580 = uVar156;
        uStack_57c = uVar156;
        uStack_578 = uVar156;
        uStack_574 = uVar156;
        uStack_570 = uVar156;
        uStack_56c = uVar156;
        uStack_568 = uVar156;
        uStack_564 = uVar156;
        fStack_730 = 1.0 / (float)local_740._0_4_;
        local_740._4_4_ = fStack_730;
        local_740._0_4_ = fStack_730;
        fStack_738 = fStack_730;
        fStack_734 = fStack_730;
        auVar148 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar148);
        auVar148 = vpbroadcastd_avx512f();
        local_400 = vmovdqa64_avx512f(auVar148);
        lVar95 = 8;
        fStack_72c = fStack_730;
        fStack_728 = fStack_730;
        fStack_724 = fStack_730;
        do {
          auVar125 = vpbroadcastd_avx512vl();
          auVar110 = vpor_avx2(auVar125,_DAT_0205a920);
          uVar31 = vpcmpgtd_avx512vl(auVar235._0_32_,auVar110);
          auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar95 * 4 + lVar66);
          auVar126 = *(undefined1 (*) [32])(lVar66 + 0x2227768 + lVar95 * 4);
          auVar124 = *(undefined1 (*) [32])(lVar66 + 0x2227bec + lVar95 * 4);
          auVar123 = *(undefined1 (*) [32])(lVar66 + 0x2228070 + lVar95 * 4);
          local_860 = auVar233._0_32_;
          auVar111 = vmulps_avx512vl(local_860,auVar123);
          local_880 = auVar234._0_32_;
          auVar122 = vmulps_avx512vl(local_880,auVar123);
          auVar47._4_4_ = auVar123._4_4_ * (float)local_360._4_4_;
          auVar47._0_4_ = auVar123._0_4_ * (float)local_360._0_4_;
          auVar47._8_4_ = auVar123._8_4_ * fStack_358;
          auVar47._12_4_ = auVar123._12_4_ * fStack_354;
          auVar47._16_4_ = auVar123._16_4_ * fStack_350;
          auVar47._20_4_ = auVar123._20_4_ * fStack_34c;
          auVar47._24_4_ = auVar123._24_4_ * fStack_348;
          auVar47._28_4_ = auVar110._28_4_;
          local_820 = auVar169._0_32_;
          auVar110 = vfmadd231ps_avx512vl(auVar111,auVar124,local_820);
          local_840 = auVar232._0_32_;
          auVar111 = vfmadd231ps_avx512vl(auVar122,auVar124,local_840);
          auVar104 = vfmadd231ps_fma(auVar47,auVar124,local_340);
          auVar130 = auVar231._0_32_;
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar126,auVar130);
          auVar131 = auVar236._0_32_;
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar126,auVar131);
          auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar126,local_320);
          auVar128 = auVar229._0_32_;
          auVar115 = vfmadd231ps_avx512vl(auVar110,auVar125,auVar128);
          auVar129 = auVar230._0_32_;
          auVar116 = vfmadd231ps_avx512vl(auVar111,auVar125,auVar129);
          auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar95 * 4 + lVar66);
          auVar111 = *(undefined1 (*) [32])(lVar66 + 0x2229b88 + lVar95 * 4);
          auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar125,local_380);
          auVar122 = *(undefined1 (*) [32])(lVar66 + 0x222a00c + lVar95 * 4);
          auVar112 = *(undefined1 (*) [32])(lVar66 + 0x222a490 + lVar95 * 4);
          auVar113 = vmulps_avx512vl(local_860,auVar112);
          auVar114 = vmulps_avx512vl(local_880,auVar112);
          auVar48._4_4_ = auVar112._4_4_ * (float)local_360._4_4_;
          auVar48._0_4_ = auVar112._0_4_ * (float)local_360._0_4_;
          auVar48._8_4_ = auVar112._8_4_ * fStack_358;
          auVar48._12_4_ = auVar112._12_4_ * fStack_354;
          auVar48._16_4_ = auVar112._16_4_ * fStack_350;
          auVar48._20_4_ = auVar112._20_4_ * fStack_34c;
          auVar48._24_4_ = auVar112._24_4_ * fStack_348;
          auVar48._28_4_ = uStack_344;
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar122,local_820);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar122,local_840);
          auVar104 = vfmadd231ps_fma(auVar48,auVar122,local_340);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar111,auVar130);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar111,auVar131);
          auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar111,local_320);
          auVar118 = vfmadd231ps_avx512vl(auVar113,auVar110,auVar128);
          auVar119 = vfmadd231ps_avx512vl(auVar114,auVar110,auVar129);
          auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar110,local_380);
          auVar121 = vmaxps_avx512vl(auVar117,auVar120);
          auVar113 = vsubps_avx(auVar118,auVar115);
          auVar114 = vsubps_avx(auVar119,auVar116);
          auVar127 = vmulps_avx512vl(auVar116,auVar113);
          in_ZMM23 = ZEXT3264(auVar131);
          auVar135 = vmulps_avx512vl(auVar115,auVar114);
          auVar127 = vsubps_avx512vl(auVar127,auVar135);
          auVar135 = vmulps_avx512vl(auVar114,auVar114);
          auVar135 = vfmadd231ps_avx512vl(auVar135,auVar113,auVar113);
          auVar121 = vmulps_avx512vl(auVar121,auVar121);
          auVar121 = vmulps_avx512vl(auVar121,auVar135);
          auVar127 = vmulps_avx512vl(auVar127,auVar127);
          uVar30 = vcmpps_avx512vl(auVar127,auVar121,2);
          local_670 = (byte)uVar31 & (byte)uVar30;
          if (local_670 == 0) {
            auVar236 = ZEXT3264(auVar131);
          }
          else {
            auVar112 = vmulps_avx512vl(local_3c0,auVar112);
            auVar122 = vfmadd213ps_avx512vl(auVar122,local_3a0,auVar112);
            auVar111 = vfmadd213ps_avx512vl(auVar111,local_500,auVar122);
            auVar110 = vfmadd213ps_avx512vl(auVar110,local_4e0,auVar111);
            auVar123 = vmulps_avx512vl(local_3c0,auVar123);
            auVar124 = vfmadd213ps_avx512vl(auVar124,local_3a0,auVar123);
            auVar126 = vfmadd213ps_avx512vl(auVar126,local_500,auVar124);
            auVar111 = vfmadd213ps_avx512vl(auVar125,local_4e0,auVar126);
            auVar125 = *(undefined1 (*) [32])(lVar66 + 0x22284f4 + lVar95 * 4);
            auVar126 = *(undefined1 (*) [32])(lVar66 + 0x2228978 + lVar95 * 4);
            auVar124 = *(undefined1 (*) [32])(lVar66 + 0x2228dfc + lVar95 * 4);
            auVar123 = *(undefined1 (*) [32])(lVar66 + 0x2229280 + lVar95 * 4);
            auVar122 = vmulps_avx512vl(local_860,auVar123);
            auVar112 = vmulps_avx512vl(local_880,auVar123);
            auVar123 = vmulps_avx512vl(local_3c0,auVar123);
            auVar122 = vfmadd231ps_avx512vl(auVar122,auVar124,local_820);
            auVar112 = vfmadd231ps_avx512vl(auVar112,auVar124,local_840);
            auVar124 = vfmadd231ps_avx512vl(auVar123,local_3a0,auVar124);
            auVar123 = vfmadd231ps_avx512vl(auVar122,auVar126,auVar130);
            auVar122 = vfmadd231ps_avx512vl(auVar112,auVar126,auVar131);
            auVar126 = vfmadd231ps_avx512vl(auVar124,local_500,auVar126);
            auVar123 = vfmadd231ps_avx512vl(auVar123,auVar125,auVar128);
            auVar122 = vfmadd231ps_avx512vl(auVar122,auVar125,auVar129);
            auVar112 = vfmadd231ps_avx512vl(auVar126,local_4e0,auVar125);
            auVar125 = *(undefined1 (*) [32])(lVar66 + 0x222a914 + lVar95 * 4);
            auVar126 = *(undefined1 (*) [32])(lVar66 + 0x222b21c + lVar95 * 4);
            auVar124 = *(undefined1 (*) [32])(lVar66 + 0x222b6a0 + lVar95 * 4);
            auVar121 = vmulps_avx512vl(local_860,auVar124);
            auVar127 = vmulps_avx512vl(local_880,auVar124);
            auVar124 = vmulps_avx512vl(local_3c0,auVar124);
            auVar121 = vfmadd231ps_avx512vl(auVar121,auVar126,local_820);
            auVar127 = vfmadd231ps_avx512vl(auVar127,auVar126,local_840);
            auVar124 = vfmadd231ps_avx512vl(auVar124,local_3a0,auVar126);
            auVar126 = *(undefined1 (*) [32])(lVar66 + 0x222ad98 + lVar95 * 4);
            auVar121 = vfmadd231ps_avx512vl(auVar121,auVar126,auVar130);
            auVar127 = vfmadd231ps_avx512vl(auVar127,auVar126,auVar131);
            auVar126 = vfmadd231ps_avx512vl(auVar124,local_500,auVar126);
            auVar124 = vfmadd231ps_avx512vl(auVar121,auVar125,auVar128);
            auVar121 = vfmadd231ps_avx512vl(auVar127,auVar125,auVar129);
            auVar126 = vfmadd231ps_avx512vl(auVar126,local_4e0,auVar125);
            auVar127 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar123,auVar127);
            vandps_avx512vl(auVar122,auVar127);
            auVar125 = vmaxps_avx(auVar127,auVar127);
            vandps_avx512vl(auVar112,auVar127);
            auVar125 = vmaxps_avx(auVar125,auVar127);
            auVar84._4_4_ = uStack_7bc;
            auVar84._0_4_ = local_7c0;
            auVar84._8_4_ = uStack_7b8;
            auVar84._12_4_ = uStack_7b4;
            auVar84._16_4_ = uStack_7b0;
            auVar84._20_4_ = uStack_7ac;
            auVar84._24_4_ = uStack_7a8;
            auVar84._28_4_ = uStack_7a4;
            uVar88 = vcmpps_avx512vl(auVar125,auVar84,1);
            bVar11 = (bool)((byte)uVar88 & 1);
            auVar136._0_4_ = (float)((uint)bVar11 * auVar113._0_4_ | (uint)!bVar11 * auVar123._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar136._4_4_ = (float)((uint)bVar11 * auVar113._4_4_ | (uint)!bVar11 * auVar123._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar136._8_4_ = (float)((uint)bVar11 * auVar113._8_4_ | (uint)!bVar11 * auVar123._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar136._12_4_ =
                 (float)((uint)bVar11 * auVar113._12_4_ | (uint)!bVar11 * auVar123._12_4_);
            bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar136._16_4_ =
                 (float)((uint)bVar11 * auVar113._16_4_ | (uint)!bVar11 * auVar123._16_4_);
            bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar136._20_4_ =
                 (float)((uint)bVar11 * auVar113._20_4_ | (uint)!bVar11 * auVar123._20_4_);
            bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar136._24_4_ =
                 (float)((uint)bVar11 * auVar113._24_4_ | (uint)!bVar11 * auVar123._24_4_);
            bVar11 = SUB81(uVar88 >> 7,0);
            auVar136._28_4_ = (uint)bVar11 * auVar113._28_4_ | (uint)!bVar11 * auVar123._28_4_;
            bVar11 = (bool)((byte)uVar88 & 1);
            auVar137._0_4_ = (float)((uint)bVar11 * auVar114._0_4_ | (uint)!bVar11 * auVar122._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar137._4_4_ = (float)((uint)bVar11 * auVar114._4_4_ | (uint)!bVar11 * auVar122._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar137._8_4_ = (float)((uint)bVar11 * auVar114._8_4_ | (uint)!bVar11 * auVar122._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar137._12_4_ =
                 (float)((uint)bVar11 * auVar114._12_4_ | (uint)!bVar11 * auVar122._12_4_);
            bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar137._16_4_ =
                 (float)((uint)bVar11 * auVar114._16_4_ | (uint)!bVar11 * auVar122._16_4_);
            bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar137._20_4_ =
                 (float)((uint)bVar11 * auVar114._20_4_ | (uint)!bVar11 * auVar122._20_4_);
            bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar137._24_4_ =
                 (float)((uint)bVar11 * auVar114._24_4_ | (uint)!bVar11 * auVar122._24_4_);
            bVar11 = SUB81(uVar88 >> 7,0);
            auVar137._28_4_ = (uint)bVar11 * auVar114._28_4_ | (uint)!bVar11 * auVar122._28_4_;
            vandps_avx512vl(auVar124,auVar127);
            vandps_avx512vl(auVar121,auVar127);
            auVar125 = vmaxps_avx(auVar137,auVar137);
            vandps_avx512vl(auVar126,auVar127);
            auVar125 = vmaxps_avx(auVar125,auVar137);
            uVar88 = vcmpps_avx512vl(auVar125,auVar84,1);
            bVar11 = (bool)((byte)uVar88 & 1);
            auVar138._0_4_ = (uint)bVar11 * auVar113._0_4_ | (uint)!bVar11 * auVar124._0_4_;
            bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar138._4_4_ = (uint)bVar11 * auVar113._4_4_ | (uint)!bVar11 * auVar124._4_4_;
            bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar138._8_4_ = (uint)bVar11 * auVar113._8_4_ | (uint)!bVar11 * auVar124._8_4_;
            bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar138._12_4_ = (uint)bVar11 * auVar113._12_4_ | (uint)!bVar11 * auVar124._12_4_;
            bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar138._16_4_ = (uint)bVar11 * auVar113._16_4_ | (uint)!bVar11 * auVar124._16_4_;
            bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar138._20_4_ = (uint)bVar11 * auVar113._20_4_ | (uint)!bVar11 * auVar124._20_4_;
            bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar138._24_4_ = (uint)bVar11 * auVar113._24_4_ | (uint)!bVar11 * auVar124._24_4_;
            bVar11 = SUB81(uVar88 >> 7,0);
            auVar138._28_4_ = (uint)bVar11 * auVar113._28_4_ | (uint)!bVar11 * auVar124._28_4_;
            bVar11 = (bool)((byte)uVar88 & 1);
            auVar139._0_4_ = (float)((uint)bVar11 * auVar114._0_4_ | (uint)!bVar11 * auVar121._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar139._4_4_ = (float)((uint)bVar11 * auVar114._4_4_ | (uint)!bVar11 * auVar121._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar139._8_4_ = (float)((uint)bVar11 * auVar114._8_4_ | (uint)!bVar11 * auVar121._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar139._12_4_ =
                 (float)((uint)bVar11 * auVar114._12_4_ | (uint)!bVar11 * auVar121._12_4_);
            bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar139._16_4_ =
                 (float)((uint)bVar11 * auVar114._16_4_ | (uint)!bVar11 * auVar121._16_4_);
            bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar139._20_4_ =
                 (float)((uint)bVar11 * auVar114._20_4_ | (uint)!bVar11 * auVar121._20_4_);
            bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar139._24_4_ =
                 (float)((uint)bVar11 * auVar114._24_4_ | (uint)!bVar11 * auVar121._24_4_);
            bVar11 = SUB81(uVar88 >> 7,0);
            auVar139._28_4_ = (uint)bVar11 * auVar114._28_4_ | (uint)!bVar11 * auVar121._28_4_;
            auVar218._8_4_ = 0x80000000;
            auVar218._0_8_ = 0x8000000080000000;
            auVar218._12_4_ = 0x80000000;
            auVar218._16_4_ = 0x80000000;
            auVar218._20_4_ = 0x80000000;
            auVar218._24_4_ = 0x80000000;
            auVar218._28_4_ = 0x80000000;
            auVar125 = vxorps_avx512vl(auVar138,auVar218);
            auVar121 = auVar228._0_32_;
            auVar126 = vfmadd213ps_avx512vl(auVar136,auVar136,auVar121);
            auVar104 = vfmadd231ps_fma(auVar126,auVar137,auVar137);
            auVar126 = vrsqrt14ps_avx512vl(ZEXT1632(auVar104));
            auVar226._8_4_ = 0xbf000000;
            auVar226._0_8_ = 0xbf000000bf000000;
            auVar226._12_4_ = 0xbf000000;
            auVar226._16_4_ = 0xbf000000;
            auVar226._20_4_ = 0xbf000000;
            auVar226._24_4_ = 0xbf000000;
            auVar226._28_4_ = 0xbf000000;
            fVar196 = auVar126._0_4_;
            fVar203 = auVar126._4_4_;
            fVar204 = auVar126._8_4_;
            fVar205 = auVar126._12_4_;
            fVar183 = auVar126._16_4_;
            fVar192 = auVar126._20_4_;
            fVar193 = auVar126._24_4_;
            auVar49._4_4_ = fVar203 * fVar203 * fVar203 * auVar104._4_4_ * -0.5;
            auVar49._0_4_ = fVar196 * fVar196 * fVar196 * auVar104._0_4_ * -0.5;
            auVar49._8_4_ = fVar204 * fVar204 * fVar204 * auVar104._8_4_ * -0.5;
            auVar49._12_4_ = fVar205 * fVar205 * fVar205 * auVar104._12_4_ * -0.5;
            auVar49._16_4_ = fVar183 * fVar183 * fVar183 * -0.0;
            auVar49._20_4_ = fVar192 * fVar192 * fVar192 * -0.0;
            auVar49._24_4_ = fVar193 * fVar193 * fVar193 * -0.0;
            auVar49._28_4_ = auVar137._28_4_;
            auVar124 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar126 = vfmadd231ps_avx512vl(auVar49,auVar124,auVar126);
            auVar50._4_4_ = auVar137._4_4_ * auVar126._4_4_;
            auVar50._0_4_ = auVar137._0_4_ * auVar126._0_4_;
            auVar50._8_4_ = auVar137._8_4_ * auVar126._8_4_;
            auVar50._12_4_ = auVar137._12_4_ * auVar126._12_4_;
            auVar50._16_4_ = auVar137._16_4_ * auVar126._16_4_;
            auVar50._20_4_ = auVar137._20_4_ * auVar126._20_4_;
            auVar50._24_4_ = auVar137._24_4_ * auVar126._24_4_;
            auVar50._28_4_ = 0;
            auVar51._4_4_ = auVar126._4_4_ * -auVar136._4_4_;
            auVar51._0_4_ = auVar126._0_4_ * -auVar136._0_4_;
            auVar51._8_4_ = auVar126._8_4_ * -auVar136._8_4_;
            auVar51._12_4_ = auVar126._12_4_ * -auVar136._12_4_;
            auVar51._16_4_ = auVar126._16_4_ * -auVar136._16_4_;
            auVar51._20_4_ = auVar126._20_4_ * -auVar136._20_4_;
            auVar51._24_4_ = auVar126._24_4_ * -auVar136._24_4_;
            auVar51._28_4_ = auVar137._28_4_;
            auVar123 = vmulps_avx512vl(auVar126,auVar121);
            auVar126 = vfmadd213ps_avx512vl(auVar138,auVar138,auVar121);
            auVar126 = vfmadd231ps_avx512vl(auVar126,auVar139,auVar139);
            auVar122 = vrsqrt14ps_avx512vl(auVar126);
            auVar126 = vmulps_avx512vl(auVar126,auVar226);
            fVar196 = auVar122._0_4_;
            fVar203 = auVar122._4_4_;
            fVar204 = auVar122._8_4_;
            fVar205 = auVar122._12_4_;
            fVar183 = auVar122._16_4_;
            fVar192 = auVar122._20_4_;
            fVar193 = auVar122._24_4_;
            auVar52._4_4_ = fVar203 * fVar203 * fVar203 * auVar126._4_4_;
            auVar52._0_4_ = fVar196 * fVar196 * fVar196 * auVar126._0_4_;
            auVar52._8_4_ = fVar204 * fVar204 * fVar204 * auVar126._8_4_;
            auVar52._12_4_ = fVar205 * fVar205 * fVar205 * auVar126._12_4_;
            auVar52._16_4_ = fVar183 * fVar183 * fVar183 * auVar126._16_4_;
            auVar52._20_4_ = fVar192 * fVar192 * fVar192 * auVar126._20_4_;
            auVar52._24_4_ = fVar193 * fVar193 * fVar193 * auVar126._24_4_;
            auVar52._28_4_ = auVar126._28_4_;
            auVar126 = vfmadd231ps_avx512vl(auVar52,auVar124,auVar122);
            auVar53._4_4_ = auVar139._4_4_ * auVar126._4_4_;
            auVar53._0_4_ = auVar139._0_4_ * auVar126._0_4_;
            auVar53._8_4_ = auVar139._8_4_ * auVar126._8_4_;
            auVar53._12_4_ = auVar139._12_4_ * auVar126._12_4_;
            auVar53._16_4_ = auVar139._16_4_ * auVar126._16_4_;
            auVar53._20_4_ = auVar139._20_4_ * auVar126._20_4_;
            auVar53._24_4_ = auVar139._24_4_ * auVar126._24_4_;
            auVar53._28_4_ = auVar122._28_4_;
            auVar54._4_4_ = auVar126._4_4_ * auVar125._4_4_;
            auVar54._0_4_ = auVar126._0_4_ * auVar125._0_4_;
            auVar54._8_4_ = auVar126._8_4_ * auVar125._8_4_;
            auVar54._12_4_ = auVar126._12_4_ * auVar125._12_4_;
            auVar54._16_4_ = auVar126._16_4_ * auVar125._16_4_;
            auVar54._20_4_ = auVar126._20_4_ * auVar125._20_4_;
            auVar54._24_4_ = auVar126._24_4_ * auVar125._24_4_;
            auVar54._28_4_ = auVar125._28_4_;
            auVar125 = vmulps_avx512vl(auVar126,auVar121);
            auVar104 = vfmadd213ps_fma(auVar50,auVar117,auVar115);
            auVar107 = vfmadd213ps_fma(auVar51,auVar117,auVar116);
            auVar124 = vfmadd213ps_avx512vl(auVar123,auVar117,auVar111);
            auVar122 = vfmadd213ps_avx512vl(auVar53,auVar120,auVar118);
            auVar29 = vfnmadd213ps_fma(auVar50,auVar117,auVar115);
            auVar227 = vfmadd213ps_fma(auVar54,auVar120,auVar119);
            auVar108 = vfnmadd213ps_fma(auVar51,auVar117,auVar116);
            auVar25 = vfmadd213ps_fma(auVar125,auVar120,auVar110);
            auVar102 = vfnmadd231ps_fma(auVar111,auVar117,auVar123);
            auVar105 = vfnmadd213ps_fma(auVar53,auVar120,auVar118);
            auVar103 = vfnmadd213ps_fma(auVar54,auVar120,auVar119);
            auVar157 = vfnmadd231ps_fma(auVar110,auVar120,auVar125);
            auVar110 = vsubps_avx512vl(auVar122,ZEXT1632(auVar29));
            auVar125 = vsubps_avx(ZEXT1632(auVar227),ZEXT1632(auVar108));
            auVar126 = vsubps_avx(ZEXT1632(auVar25),ZEXT1632(auVar102));
            auVar55._4_4_ = auVar125._4_4_ * auVar102._4_4_;
            auVar55._0_4_ = auVar125._0_4_ * auVar102._0_4_;
            auVar55._8_4_ = auVar125._8_4_ * auVar102._8_4_;
            auVar55._12_4_ = auVar125._12_4_ * auVar102._12_4_;
            auVar55._16_4_ = auVar125._16_4_ * 0.0;
            auVar55._20_4_ = auVar125._20_4_ * 0.0;
            auVar55._24_4_ = auVar125._24_4_ * 0.0;
            auVar55._28_4_ = auVar123._28_4_;
            auVar26 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar108),auVar126);
            auVar56._4_4_ = auVar126._4_4_ * auVar29._4_4_;
            auVar56._0_4_ = auVar126._0_4_ * auVar29._0_4_;
            auVar56._8_4_ = auVar126._8_4_ * auVar29._8_4_;
            auVar56._12_4_ = auVar126._12_4_ * auVar29._12_4_;
            auVar56._16_4_ = auVar126._16_4_ * 0.0;
            auVar56._20_4_ = auVar126._20_4_ * 0.0;
            auVar56._24_4_ = auVar126._24_4_ * 0.0;
            auVar56._28_4_ = auVar126._28_4_;
            auVar27 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar102),auVar110);
            auVar57._4_4_ = auVar108._4_4_ * auVar110._4_4_;
            auVar57._0_4_ = auVar108._0_4_ * auVar110._0_4_;
            auVar57._8_4_ = auVar108._8_4_ * auVar110._8_4_;
            auVar57._12_4_ = auVar108._12_4_ * auVar110._12_4_;
            auVar57._16_4_ = auVar110._16_4_ * 0.0;
            auVar57._20_4_ = auVar110._20_4_ * 0.0;
            auVar57._24_4_ = auVar110._24_4_ * 0.0;
            auVar57._28_4_ = auVar110._28_4_;
            auVar28 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar29),auVar125);
            auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar28),auVar121,ZEXT1632(auVar27));
            auVar125 = vfmadd231ps_avx512vl(auVar125,auVar121,ZEXT1632(auVar26));
            uVar88 = vcmpps_avx512vl(auVar125,auVar121,2);
            bVar99 = (byte)uVar88;
            fVar100 = (float)((uint)(bVar99 & 1) * auVar104._0_4_ |
                             (uint)!(bool)(bVar99 & 1) * auVar105._0_4_);
            bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
            fVar150 = (float)((uint)bVar11 * auVar104._4_4_ | (uint)!bVar11 * auVar105._4_4_);
            bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
            fVar152 = (float)((uint)bVar11 * auVar104._8_4_ | (uint)!bVar11 * auVar105._8_4_);
            bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
            fVar154 = (float)((uint)bVar11 * auVar104._12_4_ | (uint)!bVar11 * auVar105._12_4_);
            auVar112 = ZEXT1632(CONCAT412(fVar154,CONCAT48(fVar152,CONCAT44(fVar150,fVar100))));
            fVar101 = (float)((uint)(bVar99 & 1) * auVar107._0_4_ |
                             (uint)!(bool)(bVar99 & 1) * auVar103._0_4_);
            bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
            fVar151 = (float)((uint)bVar11 * auVar107._4_4_ | (uint)!bVar11 * auVar103._4_4_);
            bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
            fVar153 = (float)((uint)bVar11 * auVar107._8_4_ | (uint)!bVar11 * auVar103._8_4_);
            bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
            fVar155 = (float)((uint)bVar11 * auVar107._12_4_ | (uint)!bVar11 * auVar103._12_4_);
            auVar113 = ZEXT1632(CONCAT412(fVar155,CONCAT48(fVar153,CONCAT44(fVar151,fVar101))));
            auVar140._0_4_ =
                 (float)((uint)(bVar99 & 1) * auVar124._0_4_ |
                        (uint)!(bool)(bVar99 & 1) * auVar157._0_4_);
            bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar140._4_4_ = (float)((uint)bVar11 * auVar124._4_4_ | (uint)!bVar11 * auVar157._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar140._8_4_ = (float)((uint)bVar11 * auVar124._8_4_ | (uint)!bVar11 * auVar157._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar140._12_4_ =
                 (float)((uint)bVar11 * auVar124._12_4_ | (uint)!bVar11 * auVar157._12_4_);
            fVar196 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar124._16_4_);
            auVar140._16_4_ = fVar196;
            fVar203 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar124._20_4_);
            auVar140._20_4_ = fVar203;
            fVar204 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar124._24_4_);
            auVar140._24_4_ = fVar204;
            iVar1 = (uint)(byte)(uVar88 >> 7) * auVar124._28_4_;
            auVar140._28_4_ = iVar1;
            auVar125 = vblendmps_avx512vl(ZEXT1632(auVar29),auVar122);
            auVar141._0_4_ =
                 (uint)(bVar99 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar99 & 1) * auVar26._0_4_;
            bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar141._4_4_ = (uint)bVar11 * auVar125._4_4_ | (uint)!bVar11 * auVar26._4_4_;
            bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar141._8_4_ = (uint)bVar11 * auVar125._8_4_ | (uint)!bVar11 * auVar26._8_4_;
            bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar141._12_4_ = (uint)bVar11 * auVar125._12_4_ | (uint)!bVar11 * auVar26._12_4_;
            auVar141._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * auVar125._16_4_;
            auVar141._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * auVar125._20_4_;
            auVar141._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * auVar125._24_4_;
            auVar141._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar125._28_4_;
            auVar125 = vblendmps_avx512vl(ZEXT1632(auVar108),ZEXT1632(auVar227));
            auVar142._0_4_ =
                 (float)((uint)(bVar99 & 1) * auVar125._0_4_ |
                        (uint)!(bool)(bVar99 & 1) * auVar104._0_4_);
            bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar142._4_4_ = (float)((uint)bVar11 * auVar125._4_4_ | (uint)!bVar11 * auVar104._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar142._8_4_ = (float)((uint)bVar11 * auVar125._8_4_ | (uint)!bVar11 * auVar104._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar142._12_4_ =
                 (float)((uint)bVar11 * auVar125._12_4_ | (uint)!bVar11 * auVar104._12_4_);
            fVar192 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar125._16_4_);
            auVar142._16_4_ = fVar192;
            fVar183 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar125._20_4_);
            auVar142._20_4_ = fVar183;
            fVar205 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar125._24_4_);
            auVar142._24_4_ = fVar205;
            auVar142._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar125._28_4_;
            auVar125 = vblendmps_avx512vl(ZEXT1632(auVar102),ZEXT1632(auVar25));
            auVar143._0_4_ =
                 (float)((uint)(bVar99 & 1) * auVar125._0_4_ |
                        (uint)!(bool)(bVar99 & 1) * auVar107._0_4_);
            bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar143._4_4_ = (float)((uint)bVar11 * auVar125._4_4_ | (uint)!bVar11 * auVar107._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar143._8_4_ = (float)((uint)bVar11 * auVar125._8_4_ | (uint)!bVar11 * auVar107._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar143._12_4_ =
                 (float)((uint)bVar11 * auVar125._12_4_ | (uint)!bVar11 * auVar107._12_4_);
            fVar195 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar125._16_4_);
            auVar143._16_4_ = fVar195;
            fVar194 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar125._20_4_);
            auVar143._20_4_ = fVar194;
            fVar193 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar125._24_4_);
            auVar143._24_4_ = fVar193;
            iVar2 = (uint)(byte)(uVar88 >> 7) * auVar125._28_4_;
            auVar143._28_4_ = iVar2;
            auVar144._0_4_ =
                 (uint)(bVar99 & 1) * (int)auVar29._0_4_ |
                 (uint)!(bool)(bVar99 & 1) * auVar122._0_4_;
            bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar144._4_4_ = (uint)bVar11 * (int)auVar29._4_4_ | (uint)!bVar11 * auVar122._4_4_;
            bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar144._8_4_ = (uint)bVar11 * (int)auVar29._8_4_ | (uint)!bVar11 * auVar122._8_4_;
            bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar144._12_4_ = (uint)bVar11 * (int)auVar29._12_4_ | (uint)!bVar11 * auVar122._12_4_;
            auVar144._16_4_ = (uint)!(bool)((byte)(uVar88 >> 4) & 1) * auVar122._16_4_;
            auVar144._20_4_ = (uint)!(bool)((byte)(uVar88 >> 5) & 1) * auVar122._20_4_;
            auVar144._24_4_ = (uint)!(bool)((byte)(uVar88 >> 6) & 1) * auVar122._24_4_;
            auVar144._28_4_ = (uint)!SUB81(uVar88 >> 7,0) * auVar122._28_4_;
            bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar88 >> 3) & 1);
            bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar122 = vsubps_avx512vl(auVar144,auVar112);
            auVar126 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar108._12_4_ |
                                                     (uint)!bVar15 * auVar227._12_4_,
                                                     CONCAT48((uint)bVar13 * (int)auVar108._8_4_ |
                                                              (uint)!bVar13 * auVar227._8_4_,
                                                              CONCAT44((uint)bVar11 *
                                                                       (int)auVar108._4_4_ |
                                                                       (uint)!bVar11 *
                                                                       auVar227._4_4_,
                                                                       (uint)(bVar99 & 1) *
                                                                       (int)auVar108._0_4_ |
                                                                       (uint)!(bool)(bVar99 & 1) *
                                                                       auVar227._0_4_)))),auVar113);
            auVar124 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar102._12_4_ |
                                                     (uint)!bVar16 * auVar25._12_4_,
                                                     CONCAT48((uint)bVar14 * (int)auVar102._8_4_ |
                                                              (uint)!bVar14 * auVar25._8_4_,
                                                              CONCAT44((uint)bVar12 *
                                                                       (int)auVar102._4_4_ |
                                                                       (uint)!bVar12 * auVar25._4_4_
                                                                       ,(uint)(bVar99 & 1) *
                                                                        (int)auVar102._0_4_ |
                                                                        (uint)!(bool)(bVar99 & 1) *
                                                                        auVar25._0_4_)))),auVar140);
            auVar123 = vsubps_avx(auVar112,auVar141);
            auVar110 = vsubps_avx(auVar113,auVar142);
            auVar111 = vsubps_avx(auVar140,auVar143);
            auVar58._4_4_ = auVar124._4_4_ * fVar150;
            auVar58._0_4_ = auVar124._0_4_ * fVar100;
            auVar58._8_4_ = auVar124._8_4_ * fVar152;
            auVar58._12_4_ = auVar124._12_4_ * fVar154;
            auVar58._16_4_ = auVar124._16_4_ * 0.0;
            auVar58._20_4_ = auVar124._20_4_ * 0.0;
            auVar58._24_4_ = auVar124._24_4_ * 0.0;
            auVar58._28_4_ = 0;
            auVar104 = vfmsub231ps_fma(auVar58,auVar140,auVar122);
            auVar191._0_4_ = fVar101 * auVar122._0_4_;
            auVar191._4_4_ = fVar151 * auVar122._4_4_;
            auVar191._8_4_ = fVar153 * auVar122._8_4_;
            auVar191._12_4_ = fVar155 * auVar122._12_4_;
            auVar191._16_4_ = auVar122._16_4_ * 0.0;
            auVar191._20_4_ = auVar122._20_4_ * 0.0;
            auVar191._24_4_ = auVar122._24_4_ * 0.0;
            auVar191._28_4_ = 0;
            auVar107 = vfmsub231ps_fma(auVar191,auVar112,auVar126);
            auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar107),auVar121,ZEXT1632(auVar104));
            auVar201._0_4_ = auVar126._0_4_ * auVar140._0_4_;
            auVar201._4_4_ = auVar126._4_4_ * auVar140._4_4_;
            auVar201._8_4_ = auVar126._8_4_ * auVar140._8_4_;
            auVar201._12_4_ = auVar126._12_4_ * auVar140._12_4_;
            auVar201._16_4_ = auVar126._16_4_ * fVar196;
            auVar201._20_4_ = auVar126._20_4_ * fVar203;
            auVar201._24_4_ = auVar126._24_4_ * fVar204;
            auVar201._28_4_ = 0;
            auVar104 = vfmsub231ps_fma(auVar201,auVar113,auVar124);
            auVar114 = vfmadd231ps_avx512vl(auVar125,auVar121,ZEXT1632(auVar104));
            auVar125 = vmulps_avx512vl(auVar111,auVar141);
            auVar125 = vfmsub231ps_avx512vl(auVar125,auVar123,auVar143);
            auVar59._4_4_ = auVar110._4_4_ * auVar143._4_4_;
            auVar59._0_4_ = auVar110._0_4_ * auVar143._0_4_;
            auVar59._8_4_ = auVar110._8_4_ * auVar143._8_4_;
            auVar59._12_4_ = auVar110._12_4_ * auVar143._12_4_;
            auVar59._16_4_ = auVar110._16_4_ * fVar195;
            auVar59._20_4_ = auVar110._20_4_ * fVar194;
            auVar59._24_4_ = auVar110._24_4_ * fVar193;
            auVar59._28_4_ = iVar2;
            auVar104 = vfmsub231ps_fma(auVar59,auVar142,auVar111);
            auVar202._0_4_ = auVar142._0_4_ * auVar123._0_4_;
            auVar202._4_4_ = auVar142._4_4_ * auVar123._4_4_;
            auVar202._8_4_ = auVar142._8_4_ * auVar123._8_4_;
            auVar202._12_4_ = auVar142._12_4_ * auVar123._12_4_;
            auVar202._16_4_ = fVar192 * auVar123._16_4_;
            auVar202._20_4_ = fVar183 * auVar123._20_4_;
            auVar202._24_4_ = fVar205 * auVar123._24_4_;
            auVar202._28_4_ = 0;
            auVar107 = vfmsub231ps_fma(auVar202,auVar110,auVar141);
            auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar107),auVar121,auVar125);
            auVar115 = vfmadd231ps_avx512vl(auVar125,auVar121,ZEXT1632(auVar104));
            auVar125 = vmaxps_avx(auVar114,auVar115);
            uVar30 = vcmpps_avx512vl(auVar125,auVar121,2);
            local_670 = local_670 & (byte)uVar30;
            if (local_670 == 0) {
LAB_01b342b4:
              local_670 = 0;
            }
            else {
              auVar60._4_4_ = auVar111._4_4_ * auVar126._4_4_;
              auVar60._0_4_ = auVar111._0_4_ * auVar126._0_4_;
              auVar60._8_4_ = auVar111._8_4_ * auVar126._8_4_;
              auVar60._12_4_ = auVar111._12_4_ * auVar126._12_4_;
              auVar60._16_4_ = auVar111._16_4_ * auVar126._16_4_;
              auVar60._20_4_ = auVar111._20_4_ * auVar126._20_4_;
              auVar60._24_4_ = auVar111._24_4_ * auVar126._24_4_;
              auVar60._28_4_ = auVar125._28_4_;
              auVar227 = vfmsub231ps_fma(auVar60,auVar110,auVar124);
              auVar61._4_4_ = auVar124._4_4_ * auVar123._4_4_;
              auVar61._0_4_ = auVar124._0_4_ * auVar123._0_4_;
              auVar61._8_4_ = auVar124._8_4_ * auVar123._8_4_;
              auVar61._12_4_ = auVar124._12_4_ * auVar123._12_4_;
              auVar61._16_4_ = auVar124._16_4_ * auVar123._16_4_;
              auVar61._20_4_ = auVar124._20_4_ * auVar123._20_4_;
              auVar61._24_4_ = auVar124._24_4_ * auVar123._24_4_;
              auVar61._28_4_ = auVar124._28_4_;
              auVar107 = vfmsub231ps_fma(auVar61,auVar122,auVar111);
              auVar62._4_4_ = auVar110._4_4_ * auVar122._4_4_;
              auVar62._0_4_ = auVar110._0_4_ * auVar122._0_4_;
              auVar62._8_4_ = auVar110._8_4_ * auVar122._8_4_;
              auVar62._12_4_ = auVar110._12_4_ * auVar122._12_4_;
              auVar62._16_4_ = auVar110._16_4_ * auVar122._16_4_;
              auVar62._20_4_ = auVar110._20_4_ * auVar122._20_4_;
              auVar62._24_4_ = auVar110._24_4_ * auVar122._24_4_;
              auVar62._28_4_ = auVar110._28_4_;
              auVar25 = vfmsub231ps_fma(auVar62,auVar123,auVar126);
              auVar104 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar107),ZEXT1632(auVar25));
              auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),ZEXT1632(auVar227),auVar121);
              auVar126 = vrcp14ps_avx512vl(auVar125);
              auVar35._8_4_ = 0x3f800000;
              auVar35._0_8_ = &DAT_3f8000003f800000;
              auVar35._12_4_ = 0x3f800000;
              auVar35._16_4_ = 0x3f800000;
              auVar35._20_4_ = 0x3f800000;
              auVar35._24_4_ = 0x3f800000;
              auVar35._28_4_ = 0x3f800000;
              auVar124 = vfnmadd213ps_avx512vl(auVar126,auVar125,auVar35);
              auVar104 = vfmadd132ps_fma(auVar124,auVar126,auVar126);
              auVar63._4_4_ = auVar25._4_4_ * auVar140._4_4_;
              auVar63._0_4_ = auVar25._0_4_ * auVar140._0_4_;
              auVar63._8_4_ = auVar25._8_4_ * auVar140._8_4_;
              auVar63._12_4_ = auVar25._12_4_ * auVar140._12_4_;
              auVar63._16_4_ = fVar196 * 0.0;
              auVar63._20_4_ = fVar203 * 0.0;
              auVar63._24_4_ = fVar204 * 0.0;
              auVar63._28_4_ = iVar1;
              auVar107 = vfmadd231ps_fma(auVar63,auVar113,ZEXT1632(auVar107));
              auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar112,ZEXT1632(auVar227));
              fVar196 = auVar104._0_4_;
              fVar203 = auVar104._4_4_;
              fVar204 = auVar104._8_4_;
              fVar205 = auVar104._12_4_;
              auVar126 = ZEXT1632(CONCAT412(auVar107._12_4_ * fVar205,
                                            CONCAT48(auVar107._8_4_ * fVar204,
                                                     CONCAT44(auVar107._4_4_ * fVar203,
                                                              auVar107._0_4_ * fVar196))));
              auVar85._4_4_ = uStack_57c;
              auVar85._0_4_ = local_580;
              auVar85._8_4_ = uStack_578;
              auVar85._12_4_ = uStack_574;
              auVar85._16_4_ = uStack_570;
              auVar85._20_4_ = uStack_56c;
              auVar85._24_4_ = uStack_568;
              auVar85._28_4_ = uStack_564;
              uVar30 = vcmpps_avx512vl(auVar126,auVar85,0xd);
              uVar156 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar36._4_4_ = uVar156;
              auVar36._0_4_ = uVar156;
              auVar36._8_4_ = uVar156;
              auVar36._12_4_ = uVar156;
              auVar36._16_4_ = uVar156;
              auVar36._20_4_ = uVar156;
              auVar36._24_4_ = uVar156;
              auVar36._28_4_ = uVar156;
              uVar31 = vcmpps_avx512vl(auVar126,auVar36,2);
              local_670 = (byte)uVar30 & (byte)uVar31 & local_670;
              if (local_670 == 0) goto LAB_01b342b4;
              uVar30 = vcmpps_avx512vl(auVar125,auVar121,4);
              if ((local_670 & (byte)uVar30) == 0) {
                local_670 = 0;
              }
              else {
                local_670 = local_670 & (byte)uVar30;
                fVar183 = auVar114._0_4_ * fVar196;
                fVar192 = auVar114._4_4_ * fVar203;
                auVar64._4_4_ = fVar192;
                auVar64._0_4_ = fVar183;
                fVar193 = auVar114._8_4_ * fVar204;
                auVar64._8_4_ = fVar193;
                fVar194 = auVar114._12_4_ * fVar205;
                auVar64._12_4_ = fVar194;
                fVar195 = auVar114._16_4_ * 0.0;
                auVar64._16_4_ = fVar195;
                fVar100 = auVar114._20_4_ * 0.0;
                auVar64._20_4_ = fVar100;
                fVar101 = auVar114._24_4_ * 0.0;
                auVar64._24_4_ = fVar101;
                auVar64._28_4_ = auVar114._28_4_;
                fVar196 = auVar115._0_4_ * fVar196;
                fVar203 = auVar115._4_4_ * fVar203;
                auVar65._4_4_ = fVar203;
                auVar65._0_4_ = fVar196;
                fVar204 = auVar115._8_4_ * fVar204;
                auVar65._8_4_ = fVar204;
                fVar205 = auVar115._12_4_ * fVar205;
                auVar65._12_4_ = fVar205;
                fVar150 = auVar115._16_4_ * 0.0;
                auVar65._16_4_ = fVar150;
                fVar151 = auVar115._20_4_ * 0.0;
                auVar65._20_4_ = fVar151;
                fVar152 = auVar115._24_4_ * 0.0;
                auVar65._24_4_ = fVar152;
                auVar65._28_4_ = auVar115._28_4_;
                auVar212._8_4_ = 0x3f800000;
                auVar212._0_8_ = &DAT_3f8000003f800000;
                auVar212._12_4_ = 0x3f800000;
                auVar212._16_4_ = 0x3f800000;
                auVar212._20_4_ = 0x3f800000;
                auVar212._24_4_ = 0x3f800000;
                auVar212._28_4_ = 0x3f800000;
                auVar125 = vsubps_avx(auVar212,auVar64);
                local_8e0._0_4_ =
                     (uint)(bVar99 & 1) * (int)fVar183 | (uint)!(bool)(bVar99 & 1) * auVar125._0_4_;
                bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
                local_8e0._4_4_ = (uint)bVar11 * (int)fVar192 | (uint)!bVar11 * auVar125._4_4_;
                bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
                local_8e0._8_4_ = (uint)bVar11 * (int)fVar193 | (uint)!bVar11 * auVar125._8_4_;
                bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
                local_8e0._12_4_ = (uint)bVar11 * (int)fVar194 | (uint)!bVar11 * auVar125._12_4_;
                bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
                local_8e0._16_4_ = (uint)bVar11 * (int)fVar195 | (uint)!bVar11 * auVar125._16_4_;
                bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
                local_8e0._20_4_ = (uint)bVar11 * (int)fVar100 | (uint)!bVar11 * auVar125._20_4_;
                bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
                local_8e0._24_4_ = (uint)bVar11 * (int)fVar101 | (uint)!bVar11 * auVar125._24_4_;
                bVar11 = SUB81(uVar88 >> 7,0);
                local_8e0._28_4_ = (uint)bVar11 * auVar114._28_4_ | (uint)!bVar11 * auVar125._28_4_;
                auVar125 = vsubps_avx(auVar212,auVar65);
                local_5a0._0_4_ =
                     (uint)(bVar99 & 1) * (int)fVar196 | (uint)!(bool)(bVar99 & 1) * auVar125._0_4_;
                bVar11 = (bool)((byte)(uVar88 >> 1) & 1);
                local_5a0._4_4_ = (uint)bVar11 * (int)fVar203 | (uint)!bVar11 * auVar125._4_4_;
                bVar11 = (bool)((byte)(uVar88 >> 2) & 1);
                local_5a0._8_4_ = (uint)bVar11 * (int)fVar204 | (uint)!bVar11 * auVar125._8_4_;
                bVar11 = (bool)((byte)(uVar88 >> 3) & 1);
                local_5a0._12_4_ = (uint)bVar11 * (int)fVar205 | (uint)!bVar11 * auVar125._12_4_;
                bVar11 = (bool)((byte)(uVar88 >> 4) & 1);
                local_5a0._16_4_ = (uint)bVar11 * (int)fVar150 | (uint)!bVar11 * auVar125._16_4_;
                bVar11 = (bool)((byte)(uVar88 >> 5) & 1);
                local_5a0._20_4_ = (uint)bVar11 * (int)fVar151 | (uint)!bVar11 * auVar125._20_4_;
                bVar11 = (bool)((byte)(uVar88 >> 6) & 1);
                local_5a0._24_4_ = (uint)bVar11 * (int)fVar152 | (uint)!bVar11 * auVar125._24_4_;
                bVar11 = SUB81(uVar88 >> 7,0);
                local_5a0._28_4_ = (uint)bVar11 * auVar115._28_4_ | (uint)!bVar11 * auVar125._28_4_;
                local_900 = auVar126;
              }
            }
            auVar236 = ZEXT3264(local_960);
            if (local_670 != 0) {
              auVar125 = vsubps_avx(auVar120,auVar117);
              auVar104 = vfmadd213ps_fma(auVar125,local_8e0,auVar117);
              uVar156 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar37._4_4_ = uVar156;
              auVar37._0_4_ = uVar156;
              auVar37._8_4_ = uVar156;
              auVar37._12_4_ = uVar156;
              auVar37._16_4_ = uVar156;
              auVar37._20_4_ = uVar156;
              auVar37._24_4_ = uVar156;
              auVar37._28_4_ = uVar156;
              auVar125 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar104._12_4_ + auVar104._12_4_,
                                                            CONCAT48(auVar104._8_4_ + auVar104._8_4_
                                                                     ,CONCAT44(auVar104._4_4_ +
                                                                               auVar104._4_4_,
                                                                               auVar104._0_4_ +
                                                                               auVar104._0_4_)))),
                                         auVar37);
              uVar30 = vcmpps_avx512vl(local_900,auVar125,6);
              local_670 = local_670 & (byte)uVar30;
              uVar94 = (uint)local_670;
              if (local_670 != 0) {
                auVar165._8_4_ = 0xbf800000;
                auVar165._0_8_ = 0xbf800000bf800000;
                auVar165._12_4_ = 0xbf800000;
                auVar165._16_4_ = 0xbf800000;
                auVar165._20_4_ = 0xbf800000;
                auVar165._24_4_ = 0xbf800000;
                auVar165._28_4_ = 0xbf800000;
                auVar38._8_4_ = 0x40000000;
                auVar38._0_8_ = 0x4000000040000000;
                auVar38._12_4_ = 0x40000000;
                auVar38._16_4_ = 0x40000000;
                auVar38._20_4_ = 0x40000000;
                auVar38._24_4_ = 0x40000000;
                auVar38._28_4_ = 0x40000000;
                local_700 = vfmadd132ps_avx512vl(local_5a0,auVar165,auVar38);
                local_5a0 = local_700;
                auVar125 = local_5a0;
                local_6c0 = (undefined4)lVar95;
                local_6b0 = local_9b0;
                uStack_6a8 = uStack_9a8;
                local_6a0 = local_910._0_8_;
                uStack_698 = local_910._8_8_;
                local_690 = local_930._0_8_;
                uStack_688 = local_930._8_8_;
                local_680 = local_920;
                uStack_678 = uStack_918;
                pGVar96 = (context->scene->geometries).items[uVar97].ptr;
                local_5a0 = auVar125;
                if ((pGVar96->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  auVar104 = vcvtsi2ss_avx512f(auVar127._0_16_,local_6c0);
                  fVar196 = auVar104._0_4_;
                  local_660[0] = (fVar196 + local_8e0._0_4_ + 0.0) * (float)local_740._0_4_;
                  local_660[1] = (fVar196 + local_8e0._4_4_ + 1.0) * (float)local_740._4_4_;
                  local_660[2] = (fVar196 + local_8e0._8_4_ + 2.0) * fStack_738;
                  local_660[3] = (fVar196 + local_8e0._12_4_ + 3.0) * fStack_734;
                  fStack_650 = (fVar196 + local_8e0._16_4_ + 4.0) * fStack_730;
                  fStack_64c = (fVar196 + local_8e0._20_4_ + 5.0) * fStack_72c;
                  fStack_648 = (fVar196 + local_8e0._24_4_ + 6.0) * fStack_728;
                  fStack_644 = fVar196 + local_8e0._28_4_ + 7.0;
                  local_5a0._0_8_ = local_700._0_8_;
                  local_5a0._8_8_ = local_700._8_8_;
                  local_5a0._16_8_ = local_700._16_8_;
                  local_5a0._24_8_ = local_700._24_8_;
                  local_640 = local_5a0._0_8_;
                  uStack_638 = local_5a0._8_8_;
                  uStack_630 = local_5a0._16_8_;
                  uStack_628 = local_5a0._24_8_;
                  local_620 = local_900;
                  auVar166._8_4_ = 0x7f800000;
                  auVar166._0_8_ = 0x7f8000007f800000;
                  auVar166._12_4_ = 0x7f800000;
                  auVar166._16_4_ = 0x7f800000;
                  auVar166._20_4_ = 0x7f800000;
                  auVar166._24_4_ = 0x7f800000;
                  auVar166._28_4_ = 0x7f800000;
                  auVar125 = vblendmps_avx512vl(auVar166,local_900);
                  auVar145._0_4_ =
                       (uint)(local_670 & 1) * auVar125._0_4_ |
                       (uint)!(bool)(local_670 & 1) * 0x7f800000;
                  bVar11 = (bool)(local_670 >> 1 & 1);
                  auVar145._4_4_ = (uint)bVar11 * auVar125._4_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = (bool)(local_670 >> 2 & 1);
                  auVar145._8_4_ = (uint)bVar11 * auVar125._8_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = (bool)(local_670 >> 3 & 1);
                  auVar145._12_4_ = (uint)bVar11 * auVar125._12_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = (bool)(local_670 >> 4 & 1);
                  auVar145._16_4_ = (uint)bVar11 * auVar125._16_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = (bool)(local_670 >> 5 & 1);
                  auVar145._20_4_ = (uint)bVar11 * auVar125._20_4_ | (uint)!bVar11 * 0x7f800000;
                  bVar11 = (bool)(local_670 >> 6 & 1);
                  auVar145._24_4_ = (uint)bVar11 * auVar125._24_4_ | (uint)!bVar11 * 0x7f800000;
                  auVar145._28_4_ =
                       (uint)(local_670 >> 7) * auVar125._28_4_ |
                       (uint)!(bool)(local_670 >> 7) * 0x7f800000;
                  auVar125 = vshufps_avx(auVar145,auVar145,0xb1);
                  auVar125 = vminps_avx(auVar145,auVar125);
                  auVar126 = vshufpd_avx(auVar125,auVar125,5);
                  auVar125 = vminps_avx(auVar125,auVar126);
                  auVar126 = vpermpd_avx2(auVar125,0x4e);
                  auVar125 = vminps_avx(auVar125,auVar126);
                  uVar30 = vcmpps_avx512vl(auVar145,auVar125,0);
                  bVar87 = (byte)uVar30 & local_670;
                  bVar99 = local_670;
                  if (bVar87 != 0) {
                    bVar99 = bVar87;
                  }
                  uVar90 = 0;
                  for (uVar91 = (uint)bVar99; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000)
                  {
                    uVar90 = uVar90 + 1;
                  }
                  uVar88 = (ulong)uVar90;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar96->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar196 = local_660[uVar88];
                    uVar156 = *(undefined4 *)((long)&local_640 + uVar88 * 4);
                    fVar204 = 1.0 - fVar196;
                    fVar203 = fVar204 * fVar204 * -3.0;
                    auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar204 * fVar204)),
                                               ZEXT416((uint)(fVar196 * fVar204)),
                                               ZEXT416(0xc0000000));
                    auVar107 = vfmsub132ss_fma(ZEXT416((uint)(fVar196 * fVar204)),
                                               ZEXT416((uint)(fVar196 * fVar196)),
                                               ZEXT416(0x40000000));
                    fVar204 = auVar104._0_4_ * 3.0;
                    fVar205 = auVar107._0_4_ * 3.0;
                    fVar183 = fVar196 * fVar196 * 3.0;
                    auVar208._0_4_ = fVar183 * (float)local_920._0_4_;
                    auVar208._4_4_ = fVar183 * (float)local_920._4_4_;
                    auVar208._8_4_ = fVar183 * (float)uStack_918;
                    auVar208._12_4_ = fVar183 * uStack_918._4_4_;
                    auVar181._4_4_ = fVar205;
                    auVar181._0_4_ = fVar205;
                    auVar181._8_4_ = fVar205;
                    auVar181._12_4_ = fVar205;
                    auVar104 = vfmadd132ps_fma(auVar181,auVar208,local_930);
                    auVar187._4_4_ = fVar204;
                    auVar187._0_4_ = fVar204;
                    auVar187._8_4_ = fVar204;
                    auVar187._12_4_ = fVar204;
                    auVar104 = vfmadd132ps_fma(auVar187,auVar104,local_910);
                    auVar182._4_4_ = fVar203;
                    auVar182._0_4_ = fVar203;
                    auVar182._8_4_ = fVar203;
                    auVar182._12_4_ = fVar203;
                    auVar104 = vfmadd132ps_fma(auVar182,auVar104,auVar106);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar88 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar104._0_4_;
                    uVar3 = vextractps_avx(auVar104,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar3;
                    uVar3 = vextractps_avx(auVar104,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar3;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar196;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar156;
                    *(uint *)(ray + k * 4 + 0x440) = uVar7;
                    *(uint *)(ray + k * 4 + 0x480) = uVar97;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                  else {
                    local_7e0 = local_910._0_8_;
                    uStack_7d8 = local_910._8_8_;
                    local_7f0 = local_930._0_8_;
                    uStack_7e8 = local_930._8_8_;
                    local_800 = local_920;
                    uStack_7f8 = uStack_918;
                    local_520 = vmovdqa64_avx512vl(auVar235._0_32_);
                    local_970 = pGVar96;
                    local_720 = local_8e0;
                    local_6e0 = local_900;
                    local_6bc = iVar8;
                    do {
                      auVar227 = auVar228._0_16_;
                      local_440._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_660[uVar88]));
                      local_1c0 = vbroadcastss_avx512f
                                            (ZEXT416(*(uint *)((long)&local_640 + uVar88 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar88 * 4)
                      ;
                      local_9a0.context = context->user;
                      fVar205 = local_200._0_4_;
                      fVar203 = 1.0 - fVar205;
                      fVar196 = fVar203 * fVar203 * -3.0;
                      auVar104 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * fVar203)),
                                                 ZEXT416((uint)(fVar205 * fVar203)),
                                                 ZEXT416(0xc0000000));
                      auVar107 = vfmsub132ss_fma(ZEXT416((uint)(fVar205 * fVar203)),
                                                 ZEXT416((uint)(fVar205 * fVar205)),
                                                 ZEXT416(0x40000000));
                      fVar203 = auVar104._0_4_ * 3.0;
                      fVar204 = auVar107._0_4_ * 3.0;
                      fVar205 = fVar205 * fVar205 * 3.0;
                      auVar209._0_4_ = fVar205 * (float)local_800;
                      auVar209._4_4_ = fVar205 * local_800._4_4_;
                      auVar209._8_4_ = fVar205 * (float)uStack_7f8;
                      auVar209._12_4_ = fVar205 * uStack_7f8._4_4_;
                      auVar159._4_4_ = fVar204;
                      auVar159._0_4_ = fVar204;
                      auVar159._8_4_ = fVar204;
                      auVar159._12_4_ = fVar204;
                      auVar80._8_8_ = uStack_7e8;
                      auVar80._0_8_ = local_7f0;
                      auVar104 = vfmadd132ps_fma(auVar159,auVar209,auVar80);
                      auVar188._4_4_ = fVar203;
                      auVar188._0_4_ = fVar203;
                      auVar188._8_4_ = fVar203;
                      auVar188._12_4_ = fVar203;
                      auVar82._8_8_ = uStack_7d8;
                      auVar82._0_8_ = local_7e0;
                      auVar104 = vfmadd132ps_fma(auVar188,auVar104,auVar82);
                      auVar160._4_4_ = fVar196;
                      auVar160._0_4_ = fVar196;
                      auVar160._8_4_ = fVar196;
                      auVar160._12_4_ = fVar196;
                      auVar104 = vfmadd132ps_fma(auVar160,auVar104,auVar106);
                      auVar148 = vbroadcastss_avx512f(auVar104);
                      auVar149 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar149,ZEXT1664(auVar104));
                      auVar149 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar149,ZEXT1664(auVar104));
                      local_2c0[0] = (RTCHitN)auVar148[0];
                      local_2c0[1] = (RTCHitN)auVar148[1];
                      local_2c0[2] = (RTCHitN)auVar148[2];
                      local_2c0[3] = (RTCHitN)auVar148[3];
                      local_2c0[4] = (RTCHitN)auVar148[4];
                      local_2c0[5] = (RTCHitN)auVar148[5];
                      local_2c0[6] = (RTCHitN)auVar148[6];
                      local_2c0[7] = (RTCHitN)auVar148[7];
                      local_2c0[8] = (RTCHitN)auVar148[8];
                      local_2c0[9] = (RTCHitN)auVar148[9];
                      local_2c0[10] = (RTCHitN)auVar148[10];
                      local_2c0[0xb] = (RTCHitN)auVar148[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar148[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar148[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar148[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar148[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar148[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar148[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar148[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar148[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar148[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar148[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar148[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar148[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar148[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar148[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar148[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar148[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar148[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar148[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar148[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar148[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar148[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar148[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar148[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar148[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar148[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar148[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar148[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar148[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar148[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar148[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar148[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar148[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar148[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar148[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar148[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar148[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar148[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar148[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar148[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar148[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar148[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar148[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar148[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar148[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar148[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar148[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar148[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar148[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar148[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar148[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar148[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar148[0x3f];
                      local_180 = local_400._0_8_;
                      uStack_178 = local_400._8_8_;
                      uStack_170 = local_400._16_8_;
                      uStack_168 = local_400._24_8_;
                      uStack_160 = local_400._32_8_;
                      uStack_158 = local_400._40_8_;
                      uStack_150 = local_400._48_8_;
                      uStack_148 = local_400._56_8_;
                      auVar148 = vmovdqa64_avx512f(local_480);
                      local_140 = vmovdqa64_avx512f(auVar148);
                      auVar125 = vpcmpeqd_avx2(auVar148._0_32_,auVar148._0_32_);
                      local_968[3] = auVar125;
                      local_968[2] = auVar125;
                      local_968[1] = auVar125;
                      *local_968 = auVar125;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_9a0.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_9a0.context)->instPrimID[0]));
                      local_600 = local_300;
                      local_9a0.valid = (int *)local_600;
                      local_9a0.geometryUserPtr = pGVar96->userPtr;
                      local_9a0.hit = local_2c0;
                      local_9a0.N = 0x10;
                      local_4c0._0_4_ = uVar94;
                      local_9a0.ray = (RTCRayN *)ray;
                      if (pGVar96->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar96->intersectionFilterN)(&local_9a0);
                        auVar125 = vmovdqa64_avx512vl(local_520);
                        auVar235 = ZEXT3264(auVar125);
                        auVar234 = ZEXT3264(local_880);
                        auVar233 = ZEXT3264(local_860);
                        auVar232 = ZEXT3264(local_840);
                        auVar169 = ZEXT3264(local_820);
                        auVar236 = ZEXT3264(local_960);
                        auVar231 = ZEXT3264(local_7a0);
                        auVar230 = ZEXT3264(local_780);
                        auVar229 = ZEXT3264(local_760);
                        auVar104 = vxorps_avx512vl(auVar227,auVar227);
                        auVar228 = ZEXT1664(auVar104);
                        pGVar96 = local_970;
                        uVar94 = local_4c0._0_4_;
                      }
                      bVar99 = (byte)uVar94;
                      auVar104 = auVar228._0_16_;
                      auVar148 = vmovdqa64_avx512f(local_600);
                      uVar30 = vptestmd_avx512f(auVar148,auVar148);
                      if ((short)uVar30 == 0) {
LAB_01b34735:
                        *(undefined4 *)(ray + k * 4 + 0x200) = local_440._0_4_;
                      }
                      else {
                        p_Var10 = context->args->filter;
                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar96->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var10)(&local_9a0);
                          bVar99 = local_4c0[0];
                          auVar125 = vmovdqa64_avx512vl(local_520);
                          auVar235 = ZEXT3264(auVar125);
                          auVar234 = ZEXT3264(local_880);
                          auVar233 = ZEXT3264(local_860);
                          auVar232 = ZEXT3264(local_840);
                          auVar169 = ZEXT3264(local_820);
                          auVar236 = ZEXT3264(local_960);
                          auVar231 = ZEXT3264(local_7a0);
                          auVar230 = ZEXT3264(local_780);
                          auVar229 = ZEXT3264(local_760);
                          auVar104 = vxorps_avx512vl(auVar104,auVar104);
                          auVar228 = ZEXT1664(auVar104);
                          pGVar96 = local_970;
                        }
                        auVar148 = vmovdqa64_avx512f(local_600);
                        uVar92 = vptestmd_avx512f(auVar148,auVar148);
                        if ((short)uVar92 == 0) goto LAB_01b34735;
                        iVar1 = *(int *)(local_9a0.hit + 4);
                        iVar2 = *(int *)(local_9a0.hit + 8);
                        iVar67 = *(int *)(local_9a0.hit + 0xc);
                        iVar68 = *(int *)(local_9a0.hit + 0x10);
                        iVar69 = *(int *)(local_9a0.hit + 0x14);
                        iVar70 = *(int *)(local_9a0.hit + 0x18);
                        iVar71 = *(int *)(local_9a0.hit + 0x1c);
                        iVar72 = *(int *)(local_9a0.hit + 0x20);
                        iVar73 = *(int *)(local_9a0.hit + 0x24);
                        iVar74 = *(int *)(local_9a0.hit + 0x28);
                        iVar75 = *(int *)(local_9a0.hit + 0x2c);
                        iVar76 = *(int *)(local_9a0.hit + 0x30);
                        iVar77 = *(int *)(local_9a0.hit + 0x34);
                        iVar78 = *(int *)(local_9a0.hit + 0x38);
                        iVar79 = *(int *)(local_9a0.hit + 0x3c);
                        bVar87 = (byte)uVar92;
                        bVar11 = (bool)((byte)(uVar92 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar92 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar92 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar92 >> 6) & 1);
                        bVar17 = (bool)((byte)(uVar92 >> 7) & 1);
                        bVar86 = (byte)(uVar92 >> 8);
                        bVar18 = (bool)((byte)(uVar92 >> 9) & 1);
                        bVar19 = (bool)((byte)(uVar92 >> 10) & 1);
                        bVar20 = (bool)((byte)(uVar92 >> 0xb) & 1);
                        bVar21 = (bool)((byte)(uVar92 >> 0xc) & 1);
                        bVar22 = (bool)((byte)(uVar92 >> 0xd) & 1);
                        bVar23 = (bool)((byte)(uVar92 >> 0xe) & 1);
                        bVar24 = SUB81(uVar92 >> 0xf,0);
                        *(uint *)(local_9a0.ray + 0x300) =
                             (uint)(bVar87 & 1) * *(int *)local_9a0.hit |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_9a0.ray + 0x300);
                        *(uint *)(local_9a0.ray + 0x304) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_9a0.ray + 0x304);
                        *(uint *)(local_9a0.ray + 0x308) =
                             (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_9a0.ray + 0x308);
                        *(uint *)(local_9a0.ray + 0x30c) =
                             (uint)bVar13 * iVar67 | (uint)!bVar13 * *(int *)(local_9a0.ray + 0x30c)
                        ;
                        *(uint *)(local_9a0.ray + 0x310) =
                             (uint)bVar14 * iVar68 | (uint)!bVar14 * *(int *)(local_9a0.ray + 0x310)
                        ;
                        *(uint *)(local_9a0.ray + 0x314) =
                             (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_9a0.ray + 0x314)
                        ;
                        *(uint *)(local_9a0.ray + 0x318) =
                             (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_9a0.ray + 0x318)
                        ;
                        *(uint *)(local_9a0.ray + 0x31c) =
                             (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_9a0.ray + 0x31c)
                        ;
                        *(uint *)(local_9a0.ray + 800) =
                             (uint)(bVar86 & 1) * iVar72 |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_9a0.ray + 800);
                        *(uint *)(local_9a0.ray + 0x324) =
                             (uint)bVar18 * iVar73 | (uint)!bVar18 * *(int *)(local_9a0.ray + 0x324)
                        ;
                        *(uint *)(local_9a0.ray + 0x328) =
                             (uint)bVar19 * iVar74 | (uint)!bVar19 * *(int *)(local_9a0.ray + 0x328)
                        ;
                        *(uint *)(local_9a0.ray + 0x32c) =
                             (uint)bVar20 * iVar75 | (uint)!bVar20 * *(int *)(local_9a0.ray + 0x32c)
                        ;
                        *(uint *)(local_9a0.ray + 0x330) =
                             (uint)bVar21 * iVar76 | (uint)!bVar21 * *(int *)(local_9a0.ray + 0x330)
                        ;
                        *(uint *)(local_9a0.ray + 0x334) =
                             (uint)bVar22 * iVar77 | (uint)!bVar22 * *(int *)(local_9a0.ray + 0x334)
                        ;
                        *(uint *)(local_9a0.ray + 0x338) =
                             (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_9a0.ray + 0x338)
                        ;
                        *(uint *)(local_9a0.ray + 0x33c) =
                             (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_9a0.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_9a0.hit + 0x44);
                        iVar2 = *(int *)(local_9a0.hit + 0x48);
                        iVar67 = *(int *)(local_9a0.hit + 0x4c);
                        iVar68 = *(int *)(local_9a0.hit + 0x50);
                        iVar69 = *(int *)(local_9a0.hit + 0x54);
                        iVar70 = *(int *)(local_9a0.hit + 0x58);
                        iVar71 = *(int *)(local_9a0.hit + 0x5c);
                        iVar72 = *(int *)(local_9a0.hit + 0x60);
                        iVar73 = *(int *)(local_9a0.hit + 100);
                        iVar74 = *(int *)(local_9a0.hit + 0x68);
                        iVar75 = *(int *)(local_9a0.hit + 0x6c);
                        iVar76 = *(int *)(local_9a0.hit + 0x70);
                        iVar77 = *(int *)(local_9a0.hit + 0x74);
                        iVar78 = *(int *)(local_9a0.hit + 0x78);
                        iVar79 = *(int *)(local_9a0.hit + 0x7c);
                        bVar11 = (bool)((byte)(uVar92 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar92 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar92 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar92 >> 6) & 1);
                        bVar17 = (bool)((byte)(uVar92 >> 7) & 1);
                        bVar18 = (bool)((byte)(uVar92 >> 9) & 1);
                        bVar19 = (bool)((byte)(uVar92 >> 10) & 1);
                        bVar20 = (bool)((byte)(uVar92 >> 0xb) & 1);
                        bVar21 = (bool)((byte)(uVar92 >> 0xc) & 1);
                        bVar22 = (bool)((byte)(uVar92 >> 0xd) & 1);
                        bVar23 = (bool)((byte)(uVar92 >> 0xe) & 1);
                        bVar24 = SUB81(uVar92 >> 0xf,0);
                        *(uint *)(local_9a0.ray + 0x340) =
                             (uint)(bVar87 & 1) * *(int *)(local_9a0.hit + 0x40) |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_9a0.ray + 0x340);
                        *(uint *)(local_9a0.ray + 0x344) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_9a0.ray + 0x344);
                        *(uint *)(local_9a0.ray + 0x348) =
                             (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_9a0.ray + 0x348);
                        *(uint *)(local_9a0.ray + 0x34c) =
                             (uint)bVar13 * iVar67 | (uint)!bVar13 * *(int *)(local_9a0.ray + 0x34c)
                        ;
                        *(uint *)(local_9a0.ray + 0x350) =
                             (uint)bVar14 * iVar68 | (uint)!bVar14 * *(int *)(local_9a0.ray + 0x350)
                        ;
                        *(uint *)(local_9a0.ray + 0x354) =
                             (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_9a0.ray + 0x354)
                        ;
                        *(uint *)(local_9a0.ray + 0x358) =
                             (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_9a0.ray + 0x358)
                        ;
                        *(uint *)(local_9a0.ray + 0x35c) =
                             (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_9a0.ray + 0x35c)
                        ;
                        *(uint *)(local_9a0.ray + 0x360) =
                             (uint)(bVar86 & 1) * iVar72 |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_9a0.ray + 0x360);
                        *(uint *)(local_9a0.ray + 0x364) =
                             (uint)bVar18 * iVar73 | (uint)!bVar18 * *(int *)(local_9a0.ray + 0x364)
                        ;
                        *(uint *)(local_9a0.ray + 0x368) =
                             (uint)bVar19 * iVar74 | (uint)!bVar19 * *(int *)(local_9a0.ray + 0x368)
                        ;
                        *(uint *)(local_9a0.ray + 0x36c) =
                             (uint)bVar20 * iVar75 | (uint)!bVar20 * *(int *)(local_9a0.ray + 0x36c)
                        ;
                        *(uint *)(local_9a0.ray + 0x370) =
                             (uint)bVar21 * iVar76 | (uint)!bVar21 * *(int *)(local_9a0.ray + 0x370)
                        ;
                        *(uint *)(local_9a0.ray + 0x374) =
                             (uint)bVar22 * iVar77 | (uint)!bVar22 * *(int *)(local_9a0.ray + 0x374)
                        ;
                        *(uint *)(local_9a0.ray + 0x378) =
                             (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_9a0.ray + 0x378)
                        ;
                        *(uint *)(local_9a0.ray + 0x37c) =
                             (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_9a0.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_9a0.hit + 0x84);
                        iVar2 = *(int *)(local_9a0.hit + 0x88);
                        iVar67 = *(int *)(local_9a0.hit + 0x8c);
                        iVar68 = *(int *)(local_9a0.hit + 0x90);
                        iVar69 = *(int *)(local_9a0.hit + 0x94);
                        iVar70 = *(int *)(local_9a0.hit + 0x98);
                        iVar71 = *(int *)(local_9a0.hit + 0x9c);
                        iVar72 = *(int *)(local_9a0.hit + 0xa0);
                        iVar73 = *(int *)(local_9a0.hit + 0xa4);
                        iVar74 = *(int *)(local_9a0.hit + 0xa8);
                        iVar75 = *(int *)(local_9a0.hit + 0xac);
                        iVar76 = *(int *)(local_9a0.hit + 0xb0);
                        iVar77 = *(int *)(local_9a0.hit + 0xb4);
                        iVar78 = *(int *)(local_9a0.hit + 0xb8);
                        iVar79 = *(int *)(local_9a0.hit + 0xbc);
                        bVar11 = (bool)((byte)(uVar92 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar92 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar92 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar92 >> 6) & 1);
                        bVar17 = (bool)((byte)(uVar92 >> 7) & 1);
                        bVar18 = (bool)((byte)(uVar92 >> 9) & 1);
                        bVar19 = (bool)((byte)(uVar92 >> 10) & 1);
                        bVar20 = (bool)((byte)(uVar92 >> 0xb) & 1);
                        bVar21 = (bool)((byte)(uVar92 >> 0xc) & 1);
                        bVar22 = (bool)((byte)(uVar92 >> 0xd) & 1);
                        bVar23 = (bool)((byte)(uVar92 >> 0xe) & 1);
                        bVar24 = SUB81(uVar92 >> 0xf,0);
                        *(uint *)(local_9a0.ray + 0x380) =
                             (uint)(bVar87 & 1) * *(int *)(local_9a0.hit + 0x80) |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_9a0.ray + 0x380);
                        *(uint *)(local_9a0.ray + 900) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_9a0.ray + 900);
                        *(uint *)(local_9a0.ray + 0x388) =
                             (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_9a0.ray + 0x388);
                        *(uint *)(local_9a0.ray + 0x38c) =
                             (uint)bVar13 * iVar67 | (uint)!bVar13 * *(int *)(local_9a0.ray + 0x38c)
                        ;
                        *(uint *)(local_9a0.ray + 0x390) =
                             (uint)bVar14 * iVar68 | (uint)!bVar14 * *(int *)(local_9a0.ray + 0x390)
                        ;
                        *(uint *)(local_9a0.ray + 0x394) =
                             (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_9a0.ray + 0x394)
                        ;
                        *(uint *)(local_9a0.ray + 0x398) =
                             (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_9a0.ray + 0x398)
                        ;
                        *(uint *)(local_9a0.ray + 0x39c) =
                             (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_9a0.ray + 0x39c)
                        ;
                        *(uint *)(local_9a0.ray + 0x3a0) =
                             (uint)(bVar86 & 1) * iVar72 |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_9a0.ray + 0x3a0);
                        *(uint *)(local_9a0.ray + 0x3a4) =
                             (uint)bVar18 * iVar73 | (uint)!bVar18 * *(int *)(local_9a0.ray + 0x3a4)
                        ;
                        *(uint *)(local_9a0.ray + 0x3a8) =
                             (uint)bVar19 * iVar74 | (uint)!bVar19 * *(int *)(local_9a0.ray + 0x3a8)
                        ;
                        *(uint *)(local_9a0.ray + 0x3ac) =
                             (uint)bVar20 * iVar75 | (uint)!bVar20 * *(int *)(local_9a0.ray + 0x3ac)
                        ;
                        *(uint *)(local_9a0.ray + 0x3b0) =
                             (uint)bVar21 * iVar76 | (uint)!bVar21 * *(int *)(local_9a0.ray + 0x3b0)
                        ;
                        *(uint *)(local_9a0.ray + 0x3b4) =
                             (uint)bVar22 * iVar77 | (uint)!bVar22 * *(int *)(local_9a0.ray + 0x3b4)
                        ;
                        *(uint *)(local_9a0.ray + 0x3b8) =
                             (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_9a0.ray + 0x3b8)
                        ;
                        *(uint *)(local_9a0.ray + 0x3bc) =
                             (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_9a0.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_9a0.hit + 0xc4);
                        iVar2 = *(int *)(local_9a0.hit + 200);
                        iVar67 = *(int *)(local_9a0.hit + 0xcc);
                        iVar68 = *(int *)(local_9a0.hit + 0xd0);
                        iVar69 = *(int *)(local_9a0.hit + 0xd4);
                        iVar70 = *(int *)(local_9a0.hit + 0xd8);
                        iVar71 = *(int *)(local_9a0.hit + 0xdc);
                        iVar72 = *(int *)(local_9a0.hit + 0xe0);
                        iVar73 = *(int *)(local_9a0.hit + 0xe4);
                        iVar74 = *(int *)(local_9a0.hit + 0xe8);
                        iVar75 = *(int *)(local_9a0.hit + 0xec);
                        iVar76 = *(int *)(local_9a0.hit + 0xf0);
                        iVar77 = *(int *)(local_9a0.hit + 0xf4);
                        iVar78 = *(int *)(local_9a0.hit + 0xf8);
                        iVar79 = *(int *)(local_9a0.hit + 0xfc);
                        bVar11 = (bool)((byte)(uVar92 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar92 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar92 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar92 >> 6) & 1);
                        bVar17 = (bool)((byte)(uVar92 >> 7) & 1);
                        bVar18 = (bool)((byte)(uVar92 >> 9) & 1);
                        bVar19 = (bool)((byte)(uVar92 >> 10) & 1);
                        bVar20 = (bool)((byte)(uVar92 >> 0xb) & 1);
                        bVar21 = (bool)((byte)(uVar92 >> 0xc) & 1);
                        bVar22 = (bool)((byte)(uVar92 >> 0xd) & 1);
                        bVar23 = (bool)((byte)(uVar92 >> 0xe) & 1);
                        bVar24 = SUB81(uVar92 >> 0xf,0);
                        *(uint *)(local_9a0.ray + 0x3c0) =
                             (uint)(bVar87 & 1) * *(int *)(local_9a0.hit + 0xc0) |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_9a0.ray + 0x3c0);
                        *(uint *)(local_9a0.ray + 0x3c4) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_9a0.ray + 0x3c4);
                        *(uint *)(local_9a0.ray + 0x3c8) =
                             (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_9a0.ray + 0x3c8);
                        *(uint *)(local_9a0.ray + 0x3cc) =
                             (uint)bVar13 * iVar67 | (uint)!bVar13 * *(int *)(local_9a0.ray + 0x3cc)
                        ;
                        *(uint *)(local_9a0.ray + 0x3d0) =
                             (uint)bVar14 * iVar68 | (uint)!bVar14 * *(int *)(local_9a0.ray + 0x3d0)
                        ;
                        *(uint *)(local_9a0.ray + 0x3d4) =
                             (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_9a0.ray + 0x3d4)
                        ;
                        *(uint *)(local_9a0.ray + 0x3d8) =
                             (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_9a0.ray + 0x3d8)
                        ;
                        *(uint *)(local_9a0.ray + 0x3dc) =
                             (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_9a0.ray + 0x3dc)
                        ;
                        *(uint *)(local_9a0.ray + 0x3e0) =
                             (uint)(bVar86 & 1) * iVar72 |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_9a0.ray + 0x3e0);
                        *(uint *)(local_9a0.ray + 0x3e4) =
                             (uint)bVar18 * iVar73 | (uint)!bVar18 * *(int *)(local_9a0.ray + 0x3e4)
                        ;
                        *(uint *)(local_9a0.ray + 1000) =
                             (uint)bVar19 * iVar74 | (uint)!bVar19 * *(int *)(local_9a0.ray + 1000);
                        *(uint *)(local_9a0.ray + 0x3ec) =
                             (uint)bVar20 * iVar75 | (uint)!bVar20 * *(int *)(local_9a0.ray + 0x3ec)
                        ;
                        *(uint *)(local_9a0.ray + 0x3f0) =
                             (uint)bVar21 * iVar76 | (uint)!bVar21 * *(int *)(local_9a0.ray + 0x3f0)
                        ;
                        *(uint *)(local_9a0.ray + 0x3f4) =
                             (uint)bVar22 * iVar77 | (uint)!bVar22 * *(int *)(local_9a0.ray + 0x3f4)
                        ;
                        *(uint *)(local_9a0.ray + 0x3f8) =
                             (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_9a0.ray + 0x3f8)
                        ;
                        *(uint *)(local_9a0.ray + 0x3fc) =
                             (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_9a0.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_9a0.hit + 0x104);
                        iVar2 = *(int *)(local_9a0.hit + 0x108);
                        iVar67 = *(int *)(local_9a0.hit + 0x10c);
                        iVar68 = *(int *)(local_9a0.hit + 0x110);
                        iVar69 = *(int *)(local_9a0.hit + 0x114);
                        iVar70 = *(int *)(local_9a0.hit + 0x118);
                        iVar71 = *(int *)(local_9a0.hit + 0x11c);
                        iVar72 = *(int *)(local_9a0.hit + 0x120);
                        iVar73 = *(int *)(local_9a0.hit + 0x124);
                        iVar74 = *(int *)(local_9a0.hit + 0x128);
                        iVar75 = *(int *)(local_9a0.hit + 300);
                        iVar76 = *(int *)(local_9a0.hit + 0x130);
                        iVar77 = *(int *)(local_9a0.hit + 0x134);
                        iVar78 = *(int *)(local_9a0.hit + 0x138);
                        iVar79 = *(int *)(local_9a0.hit + 0x13c);
                        bVar11 = (bool)((byte)(uVar92 >> 1) & 1);
                        bVar12 = (bool)((byte)(uVar92 >> 2) & 1);
                        bVar13 = (bool)((byte)(uVar92 >> 3) & 1);
                        bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
                        bVar15 = (bool)((byte)(uVar92 >> 5) & 1);
                        bVar16 = (bool)((byte)(uVar92 >> 6) & 1);
                        bVar17 = (bool)((byte)(uVar92 >> 7) & 1);
                        bVar18 = (bool)((byte)(uVar92 >> 9) & 1);
                        bVar19 = (bool)((byte)(uVar92 >> 10) & 1);
                        bVar20 = (bool)((byte)(uVar92 >> 0xb) & 1);
                        bVar21 = (bool)((byte)(uVar92 >> 0xc) & 1);
                        bVar22 = (bool)((byte)(uVar92 >> 0xd) & 1);
                        bVar23 = (bool)((byte)(uVar92 >> 0xe) & 1);
                        bVar24 = SUB81(uVar92 >> 0xf,0);
                        *(uint *)(local_9a0.ray + 0x400) =
                             (uint)(bVar87 & 1) * *(int *)(local_9a0.hit + 0x100) |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_9a0.ray + 0x400);
                        *(uint *)(local_9a0.ray + 0x404) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_9a0.ray + 0x404);
                        *(uint *)(local_9a0.ray + 0x408) =
                             (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_9a0.ray + 0x408);
                        *(uint *)(local_9a0.ray + 0x40c) =
                             (uint)bVar13 * iVar67 | (uint)!bVar13 * *(int *)(local_9a0.ray + 0x40c)
                        ;
                        *(uint *)(local_9a0.ray + 0x410) =
                             (uint)bVar14 * iVar68 | (uint)!bVar14 * *(int *)(local_9a0.ray + 0x410)
                        ;
                        *(uint *)(local_9a0.ray + 0x414) =
                             (uint)bVar15 * iVar69 | (uint)!bVar15 * *(int *)(local_9a0.ray + 0x414)
                        ;
                        *(uint *)(local_9a0.ray + 0x418) =
                             (uint)bVar16 * iVar70 | (uint)!bVar16 * *(int *)(local_9a0.ray + 0x418)
                        ;
                        *(uint *)(local_9a0.ray + 0x41c) =
                             (uint)bVar17 * iVar71 | (uint)!bVar17 * *(int *)(local_9a0.ray + 0x41c)
                        ;
                        *(uint *)(local_9a0.ray + 0x420) =
                             (uint)(bVar86 & 1) * iVar72 |
                             (uint)!(bool)(bVar86 & 1) * *(int *)(local_9a0.ray + 0x420);
                        *(uint *)(local_9a0.ray + 0x424) =
                             (uint)bVar18 * iVar73 | (uint)!bVar18 * *(int *)(local_9a0.ray + 0x424)
                        ;
                        *(uint *)(local_9a0.ray + 0x428) =
                             (uint)bVar19 * iVar74 | (uint)!bVar19 * *(int *)(local_9a0.ray + 0x428)
                        ;
                        *(uint *)(local_9a0.ray + 0x42c) =
                             (uint)bVar20 * iVar75 | (uint)!bVar20 * *(int *)(local_9a0.ray + 0x42c)
                        ;
                        *(uint *)(local_9a0.ray + 0x430) =
                             (uint)bVar21 * iVar76 | (uint)!bVar21 * *(int *)(local_9a0.ray + 0x430)
                        ;
                        *(uint *)(local_9a0.ray + 0x434) =
                             (uint)bVar22 * iVar77 | (uint)!bVar22 * *(int *)(local_9a0.ray + 0x434)
                        ;
                        *(uint *)(local_9a0.ray + 0x438) =
                             (uint)bVar23 * iVar78 | (uint)!bVar23 * *(int *)(local_9a0.ray + 0x438)
                        ;
                        *(uint *)(local_9a0.ray + 0x43c) =
                             (uint)bVar24 * iVar79 | (uint)!bVar24 * *(int *)(local_9a0.ray + 0x43c)
                        ;
                        auVar148 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_9a0.hit + 0x140));
                        auVar148 = vmovdqu32_avx512f(auVar148);
                        *(undefined1 (*) [64])(local_9a0.ray + 0x440) = auVar148;
                        auVar148 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_9a0.hit + 0x180));
                        auVar148 = vmovdqu32_avx512f(auVar148);
                        *(undefined1 (*) [64])(local_9a0.ray + 0x480) = auVar148;
                        auVar148 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_9a0.hit + 0x1c0));
                        auVar148 = vmovdqa32_avx512f(auVar148);
                        *(undefined1 (*) [64])(local_9a0.ray + 0x4c0) = auVar148;
                        auVar148 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_9a0.hit + 0x200));
                        auVar148 = vmovdqa32_avx512f(auVar148);
                        *(undefined1 (*) [64])(local_9a0.ray + 0x500) = auVar148;
                      }
                      bVar99 = ~(byte)(1 << ((uint)uVar88 & 0x1f)) & bVar99;
                      uVar156 = *(undefined4 *)(ray + k * 4 + 0x200);
                      auVar39._4_4_ = uVar156;
                      auVar39._0_4_ = uVar156;
                      auVar39._8_4_ = uVar156;
                      auVar39._12_4_ = uVar156;
                      auVar39._16_4_ = uVar156;
                      auVar39._20_4_ = uVar156;
                      auVar39._24_4_ = uVar156;
                      auVar39._28_4_ = uVar156;
                      uVar30 = vcmpps_avx512vl(local_900,auVar39,2);
                      bVar87 = bVar99 & (byte)uVar30;
                      uVar94 = (uint)bVar87;
                      if ((bVar99 & (byte)uVar30) != 0) {
                        auVar167._8_4_ = 0x7f800000;
                        auVar167._0_8_ = 0x7f8000007f800000;
                        auVar167._12_4_ = 0x7f800000;
                        auVar167._16_4_ = 0x7f800000;
                        auVar167._20_4_ = 0x7f800000;
                        auVar167._24_4_ = 0x7f800000;
                        auVar167._28_4_ = 0x7f800000;
                        auVar125 = vblendmps_avx512vl(auVar167,local_900);
                        auVar146._0_4_ =
                             (uint)(bVar87 & 1) * auVar125._0_4_ |
                             (uint)!(bool)(bVar87 & 1) * 0x7f800000;
                        bVar11 = (bool)(bVar87 >> 1 & 1);
                        auVar146._4_4_ = (uint)bVar11 * auVar125._4_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar87 >> 2 & 1);
                        auVar146._8_4_ = (uint)bVar11 * auVar125._8_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar87 >> 3 & 1);
                        auVar146._12_4_ =
                             (uint)bVar11 * auVar125._12_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar87 >> 4 & 1);
                        auVar146._16_4_ =
                             (uint)bVar11 * auVar125._16_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar87 >> 5 & 1);
                        auVar146._20_4_ =
                             (uint)bVar11 * auVar125._20_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar87 >> 6 & 1);
                        auVar146._24_4_ =
                             (uint)bVar11 * auVar125._24_4_ | (uint)!bVar11 * 0x7f800000;
                        auVar146._28_4_ =
                             (uint)(bVar87 >> 7) * auVar125._28_4_ |
                             (uint)!(bool)(bVar87 >> 7) * 0x7f800000;
                        auVar125 = vshufps_avx(auVar146,auVar146,0xb1);
                        auVar125 = vminps_avx(auVar146,auVar125);
                        auVar126 = vshufpd_avx(auVar125,auVar125,5);
                        auVar125 = vminps_avx(auVar125,auVar126);
                        auVar126 = vpermpd_avx2(auVar125,0x4e);
                        auVar125 = vminps_avx(auVar125,auVar126);
                        uVar30 = vcmpps_avx512vl(auVar146,auVar125,0);
                        bVar99 = (byte)uVar30 & bVar87;
                        uVar90 = uVar94;
                        if (bVar99 != 0) {
                          uVar90 = (uint)bVar99;
                        }
                        uVar91 = 0;
                        for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                          uVar91 = uVar91 + 1;
                        }
                        uVar88 = (ulong)uVar91;
                      }
                    } while (bVar87 != 0);
                  }
                }
              }
            }
          }
          lVar95 = lVar95 + 8;
        } while ((int)lVar95 < iVar8);
      }
      uVar156 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar32._4_4_ = uVar156;
      auVar32._0_4_ = uVar156;
      auVar32._8_4_ = uVar156;
      auVar32._12_4_ = uVar156;
      uVar30 = vcmpps_avx512vl(local_530,auVar32,2);
      uVar97 = (uint)uVar98 & (uint)uVar98 + 0xf & (uint)uVar30;
      uVar98 = (ulong)uVar97;
    } while (uVar97 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }